

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::BSplineCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  bool bVar50;
  int iVar51;
  ulong uVar52;
  RTCIntersectArguments *pRVar53;
  undefined4 uVar54;
  RTCIntersectArguments *pRVar55;
  ulong uVar56;
  long lVar57;
  Geometry *geometry;
  long lVar58;
  undefined1 auVar59 [8];
  ulong uVar60;
  ulong uVar61;
  bool bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  float fVar70;
  float fVar100;
  float fVar102;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar71;
  float fVar101;
  float fVar103;
  float fVar104;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  float fVar106;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar127;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar126;
  float fVar128;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar137;
  float fVar139;
  vfloat4 v;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar142;
  float fVar143;
  float fVar155;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar161;
  float fVar173;
  float fVar175;
  undefined1 auVar162 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar178;
  float fVar179;
  float fVar201;
  float fVar203;
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar202;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  float fVar207;
  float fVar211;
  float fVar212;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar225;
  float fVar226;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar234;
  float fVar235;
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar237;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  float fVar246;
  float fVar247;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  float fVar268;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar273;
  float fVar274;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar282;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  bool local_449;
  int local_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  undefined8 uStack_3e0;
  undefined1 local_3d8 [8];
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  ulong local_308;
  Precalculations *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  RTCFilterFunctionNArguments local_2a8;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  float local_230;
  float local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  uint local_21c;
  uint local_218;
  ulong local_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Primitive *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  uint local_168;
  float local_164;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  float local_108 [4];
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8 [4];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 uVar98;
  undefined2 uVar99;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  
  PVar18 = prim[1];
  uVar52 = (ulong)(byte)PVar18;
  lVar22 = uVar52 * 0x25;
  pPVar8 = prim + lVar22 + 6;
  fVar139 = *(float *)(pPVar8 + 0xc);
  fVar142 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar139;
  fVar155 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar139;
  fVar157 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar139;
  fVar130 = fVar139 * (ray->dir).field_0.m128[0];
  fVar137 = fVar139 * (ray->dir).field_0.m128[1];
  fVar139 = fVar139 * (ray->dir).field_0.m128[2];
  uVar54 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar60;
  auVar133._12_2_ = uVar99;
  auVar133._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar72._12_4_ = auVar133._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar60;
  auVar72._10_2_ = uVar99;
  auVar73._10_6_ = auVar72._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar29._4_8_ = auVar73._8_8_;
  auVar29._2_2_ = uVar99;
  auVar29._0_2_ = uVar99;
  fVar273 = (float)((int)sVar69 >> 8);
  fVar279 = (float)(auVar29._0_4_ >> 0x18);
  fVar280 = (float)(auVar73._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar60;
  auVar109._12_2_ = uVar99;
  auVar109._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar60;
  auVar108._10_2_ = uVar99;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar99;
  auVar107._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar30._4_8_ = auVar107._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar160 = (float)((int)sVar69 >> 8);
  fVar173 = (float)(auVar30._0_4_ >> 0x18);
  fVar175 = (float)(auVar107._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar60;
  auVar112._12_2_ = uVar99;
  auVar112._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar60;
  auVar111._10_2_ = uVar99;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar99;
  auVar110._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar31._4_8_ = auVar110._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar206 = (float)((int)sVar69 >> 8);
  fVar211 = (float)(auVar31._0_4_ >> 0x18);
  fVar212 = (float)(auVar110._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0xf + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar60;
  auVar115._12_2_ = uVar99;
  auVar115._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar60;
  auVar114._10_2_ = uVar99;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar99;
  auVar113._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar32._4_8_ = auVar113._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar100 = (float)(auVar32._0_4_ >> 0x18);
  fVar102 = (float)(auVar113._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar60;
  auVar182._12_2_ = uVar99;
  auVar182._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar60;
  auVar181._10_2_ = uVar99;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar99;
  auVar180._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar33._4_8_ = auVar180._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar213 = (float)((int)sVar69 >> 8);
  fVar220 = (float)(auVar33._0_4_ >> 0x18);
  fVar221 = (float)(auVar180._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar52 + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar60;
  auVar185._12_2_ = uVar99;
  auVar185._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar60;
  auVar184._10_2_ = uVar99;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar99;
  auVar183._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar34._4_8_ = auVar183._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar227 = (float)((int)sVar69 >> 8);
  fVar234 = (float)(auVar34._0_4_ >> 0x18);
  fVar235 = (float)(auVar183._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0x1a + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar60;
  auVar188._12_2_ = uVar99;
  auVar188._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar60;
  auVar187._10_2_ = uVar99;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar99;
  auVar186._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar35._4_8_ = auVar186._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  fVar222 = (float)((int)sVar69 >> 8);
  fVar225 = (float)(auVar35._0_4_ >> 0x18);
  fVar226 = (float)(auVar186._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0x1b + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar60;
  auVar191._12_2_ = uVar99;
  auVar191._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar60;
  auVar190._10_2_ = uVar99;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar99;
  auVar189._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar36._4_8_ = auVar189._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar236 = (float)((int)sVar69 >> 8);
  fVar242 = (float)(auVar36._0_4_ >> 0x18);
  fVar244 = (float)(auVar189._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0x1c + 6);
  uVar98 = (undefined1)((uint)uVar54 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar54));
  uVar98 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar69);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar60;
  auVar194._12_2_ = uVar99;
  auVar194._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar60;
  auVar193._10_2_ = uVar99;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar99;
  auVar192._0_8_ = uVar60;
  uVar99 = (undefined2)uVar28;
  auVar37._4_8_ = auVar192._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  fVar105 = (float)((int)sVar69 >> 8);
  fVar123 = (float)(auVar37._0_4_ >> 0x18);
  fVar125 = (float)(auVar192._8_4_ >> 0x18);
  fVar257 = fVar130 * fVar273 + fVar137 * fVar160 + fVar139 * fVar206;
  fVar267 = fVar130 * fVar279 + fVar137 * fVar173 + fVar139 * fVar211;
  fVar271 = fVar130 * fVar280 + fVar137 * fVar175 + fVar139 * fVar212;
  fVar272 = fVar130 * (float)(auVar72._12_4_ >> 0x18) +
            fVar137 * (float)(auVar108._12_4_ >> 0x18) + fVar139 * (float)(auVar111._12_4_ >> 0x18);
  fVar247 = fVar130 * fVar70 + fVar137 * fVar213 + fVar139 * fVar227;
  fVar254 = fVar130 * fVar100 + fVar137 * fVar220 + fVar139 * fVar234;
  fVar255 = fVar130 * fVar102 + fVar137 * fVar221 + fVar139 * fVar235;
  fVar256 = fVar130 * (float)(auVar114._12_4_ >> 0x18) +
            fVar137 * (float)(auVar181._12_4_ >> 0x18) + fVar139 * (float)(auVar184._12_4_ >> 0x18);
  fVar178 = fVar130 * fVar222 + fVar137 * fVar236 + fVar139 * fVar105;
  fVar201 = fVar130 * fVar225 + fVar137 * fVar242 + fVar139 * fVar123;
  fVar203 = fVar130 * fVar226 + fVar137 * fVar244 + fVar139 * fVar125;
  fVar130 = fVar130 * (float)(auVar187._12_4_ >> 0x18) +
            fVar137 * (float)(auVar190._12_4_ >> 0x18) + fVar139 * (float)(auVar193._12_4_ >> 0x18);
  fVar274 = fVar273 * fVar142 + fVar160 * fVar155 + fVar206 * fVar157;
  fVar279 = fVar279 * fVar142 + fVar173 * fVar155 + fVar211 * fVar157;
  fVar280 = fVar280 * fVar142 + fVar175 * fVar155 + fVar212 * fVar157;
  fVar281 = (float)(auVar72._12_4_ >> 0x18) * fVar142 +
            (float)(auVar108._12_4_ >> 0x18) * fVar155 + (float)(auVar111._12_4_ >> 0x18) * fVar157;
  fVar227 = fVar70 * fVar142 + fVar213 * fVar155 + fVar227 * fVar157;
  fVar234 = fVar100 * fVar142 + fVar220 * fVar155 + fVar234 * fVar157;
  fVar235 = fVar102 * fVar142 + fVar221 * fVar155 + fVar235 * fVar157;
  fVar273 = (float)(auVar114._12_4_ >> 0x18) * fVar142 +
            (float)(auVar181._12_4_ >> 0x18) * fVar155 + (float)(auVar184._12_4_ >> 0x18) * fVar157;
  fVar222 = fVar142 * fVar222 + fVar155 * fVar236 + fVar157 * fVar105;
  fVar225 = fVar142 * fVar225 + fVar155 * fVar242 + fVar157 * fVar123;
  fVar226 = fVar142 * fVar226 + fVar155 * fVar244 + fVar157 * fVar125;
  fVar236 = fVar142 * (float)(auVar187._12_4_ >> 0x18) +
            fVar155 * (float)(auVar190._12_4_ >> 0x18) + fVar157 * (float)(auVar193._12_4_ >> 0x18);
  fVar139 = (float)DAT_01ff1d40;
  fVar70 = DAT_01ff1d40._4_4_;
  fVar100 = DAT_01ff1d40._8_4_;
  fVar102 = DAT_01ff1d40._12_4_;
  uVar63 = -(uint)(fVar139 <= ABS(fVar257));
  uVar64 = -(uint)(fVar70 <= ABS(fVar267));
  uVar65 = -(uint)(fVar100 <= ABS(fVar271));
  uVar66 = -(uint)(fVar102 <= ABS(fVar272));
  auVar260._0_4_ = (uint)fVar257 & uVar63;
  auVar260._4_4_ = (uint)fVar267 & uVar64;
  auVar260._8_4_ = (uint)fVar271 & uVar65;
  auVar260._12_4_ = (uint)fVar272 & uVar66;
  auVar144._0_4_ = ~uVar63 & (uint)fVar139;
  auVar144._4_4_ = ~uVar64 & (uint)fVar70;
  auVar144._8_4_ = ~uVar65 & (uint)fVar100;
  auVar144._12_4_ = ~uVar66 & (uint)fVar102;
  auVar144 = auVar144 | auVar260;
  uVar63 = -(uint)(fVar139 <= ABS(fVar247));
  uVar64 = -(uint)(fVar70 <= ABS(fVar254));
  uVar65 = -(uint)(fVar100 <= ABS(fVar255));
  uVar66 = -(uint)(fVar102 <= ABS(fVar256));
  auVar248._0_4_ = (uint)fVar247 & uVar63;
  auVar248._4_4_ = (uint)fVar254 & uVar64;
  auVar248._8_4_ = (uint)fVar255 & uVar65;
  auVar248._12_4_ = (uint)fVar256 & uVar66;
  auVar208._0_4_ = ~uVar63 & (uint)fVar139;
  auVar208._4_4_ = ~uVar64 & (uint)fVar70;
  auVar208._8_4_ = ~uVar65 & (uint)fVar100;
  auVar208._12_4_ = ~uVar66 & (uint)fVar102;
  auVar208 = auVar208 | auVar248;
  uVar63 = -(uint)(fVar139 <= ABS(fVar178));
  uVar64 = -(uint)(fVar70 <= ABS(fVar201));
  uVar65 = -(uint)(fVar100 <= ABS(fVar203));
  uVar66 = -(uint)(fVar102 <= ABS(fVar130));
  auVar195._0_4_ = (uint)fVar178 & uVar63;
  auVar195._4_4_ = (uint)fVar201 & uVar64;
  auVar195._8_4_ = (uint)fVar203 & uVar65;
  auVar195._12_4_ = (uint)fVar130 & uVar66;
  auVar214._0_4_ = ~uVar63 & (uint)fVar139;
  auVar214._4_4_ = ~uVar64 & (uint)fVar70;
  auVar214._8_4_ = ~uVar65 & (uint)fVar100;
  auVar214._12_4_ = ~uVar66 & (uint)fVar102;
  auVar214 = auVar214 | auVar195;
  auVar73 = rcpps(_DAT_01ff1d40,auVar144);
  fVar139 = auVar73._0_4_;
  fVar102 = auVar73._4_4_;
  fVar160 = auVar73._8_4_;
  fVar213 = auVar73._12_4_;
  fVar139 = (1.0 - auVar144._0_4_ * fVar139) * fVar139 + fVar139;
  fVar102 = (1.0 - auVar144._4_4_ * fVar102) * fVar102 + fVar102;
  fVar160 = (1.0 - auVar144._8_4_ * fVar160) * fVar160 + fVar160;
  fVar213 = (1.0 - auVar144._12_4_ * fVar213) * fVar213 + fVar213;
  auVar73 = rcpps(auVar73,auVar208);
  fVar70 = auVar73._0_4_;
  fVar105 = auVar73._4_4_;
  fVar173 = auVar73._8_4_;
  fVar220 = auVar73._12_4_;
  fVar70 = (1.0 - auVar208._0_4_ * fVar70) * fVar70 + fVar70;
  fVar105 = (1.0 - auVar208._4_4_ * fVar105) * fVar105 + fVar105;
  fVar173 = (1.0 - auVar208._8_4_ * fVar173) * fVar173 + fVar173;
  fVar220 = (1.0 - auVar208._12_4_ * fVar220) * fVar220 + fVar220;
  auVar73 = rcpps(auVar73,auVar214);
  fVar100 = auVar73._0_4_;
  fVar123 = auVar73._4_4_;
  fVar175 = auVar73._8_4_;
  fVar221 = auVar73._12_4_;
  fVar100 = (1.0 - auVar214._0_4_ * fVar100) * fVar100 + fVar100;
  fVar123 = (1.0 - auVar214._4_4_ * fVar123) * fVar123 + fVar123;
  fVar175 = (1.0 - auVar214._8_4_ * fVar175) * fVar175 + fVar175;
  fVar221 = (1.0 - auVar214._12_4_ * fVar221) * fVar221 + fVar221;
  fVar242 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar99 = (undefined2)(uVar60 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar60;
  auVar76._12_2_ = uVar99;
  auVar76._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar60 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar60;
  auVar75._10_2_ = uVar99;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar99;
  auVar74._0_8_ = uVar60;
  uVar99 = (undefined2)(uVar60 >> 0x10);
  auVar38._4_8_ = auVar74._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar125 = (float)(auVar38._0_4_ >> 0x10);
  fVar178 = (float)(auVar74._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar52 * 0xb + 6);
  uVar99 = (undefined2)(uVar56 >> 0x30);
  auVar147._8_4_ = 0;
  auVar147._0_8_ = uVar56;
  auVar147._12_2_ = uVar99;
  auVar147._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar56 >> 0x20);
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._8_2_ = 0;
  auVar146._0_8_ = uVar56;
  auVar146._10_2_ = uVar99;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._8_2_ = uVar99;
  auVar145._0_8_ = uVar56;
  uVar99 = (undefined2)(uVar56 >> 0x10);
  auVar39._4_8_ = auVar145._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  uVar10 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar99 = (undefined2)(uVar10 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar10;
  auVar79._12_2_ = uVar99;
  auVar79._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar10 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar10;
  auVar78._10_2_ = uVar99;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar99;
  auVar77._0_8_ = uVar10;
  uVar99 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar77._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  fVar130 = (float)(auVar40._0_4_ >> 0x10);
  fVar201 = (float)(auVar77._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar52 * 0xd + 6);
  uVar99 = (undefined2)(uVar11 >> 0x30);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar11;
  auVar217._12_2_ = uVar99;
  auVar217._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar11 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar11;
  auVar216._10_2_ = uVar99;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar99;
  auVar215._0_8_ = uVar11;
  uVar99 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar215._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  uVar12 = *(ulong *)(prim + uVar52 * 0x12 + 6);
  uVar99 = (undefined2)(uVar12 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar12;
  auVar82._12_2_ = uVar99;
  auVar82._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar12 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar12;
  auVar81._10_2_ = uVar99;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar99;
  auVar80._0_8_ = uVar12;
  uVar99 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar80._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  fVar137 = (float)(auVar42._0_4_ >> 0x10);
  fVar203 = (float)(auVar80._8_4_ >> 0x10);
  uVar61 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar52 * 2 + uVar61 + 6);
  uVar99 = (undefined2)(uVar13 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar13;
  auVar230._12_2_ = uVar99;
  auVar230._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar13 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar13;
  auVar229._10_2_ = uVar99;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar99;
  auVar228._0_8_ = uVar13;
  uVar99 = (undefined2)(uVar13 >> 0x10);
  auVar43._4_8_ = auVar228._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  uVar61 = *(ulong *)(prim + uVar61 + 6);
  uVar99 = (undefined2)(uVar61 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar61;
  auVar85._12_2_ = uVar99;
  auVar85._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar61 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar61;
  auVar84._10_2_ = uVar99;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar99;
  auVar83._0_8_ = uVar61;
  uVar99 = (undefined2)(uVar61 >> 0x10);
  auVar44._4_8_ = auVar83._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  fVar142 = (float)(auVar44._0_4_ >> 0x10);
  fVar206 = (float)(auVar83._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar52 * 0x18 + 6);
  uVar99 = (undefined2)(uVar14 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar14;
  auVar240._12_2_ = uVar99;
  auVar240._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar14 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar14;
  auVar239._10_2_ = uVar99;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar99;
  auVar238._0_8_ = uVar14;
  uVar99 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar238._8_8_;
  auVar45._2_2_ = uVar99;
  auVar45._0_2_ = uVar99;
  uVar15 = *(ulong *)(prim + uVar52 * 0x1d + 6);
  uVar99 = (undefined2)(uVar15 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar15;
  auVar88._12_2_ = uVar99;
  auVar88._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar15 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar15;
  auVar87._10_2_ = uVar99;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar99;
  auVar86._0_8_ = uVar15;
  uVar99 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar86._8_8_;
  auVar46._2_2_ = uVar99;
  auVar46._0_2_ = uVar99;
  fVar155 = (float)(auVar46._0_4_ >> 0x10);
  fVar211 = (float)(auVar86._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar52 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar99 = (undefined2)(uVar16 >> 0x30);
  auVar251._8_4_ = 0;
  auVar251._0_8_ = uVar16;
  auVar251._12_2_ = uVar99;
  auVar251._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar16 >> 0x20);
  auVar250._12_4_ = auVar251._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar16;
  auVar250._10_2_ = uVar99;
  auVar249._10_6_ = auVar250._10_6_;
  auVar249._8_2_ = uVar99;
  auVar249._0_8_ = uVar16;
  uVar99 = (undefined2)(uVar16 >> 0x10);
  auVar47._4_8_ = auVar249._8_8_;
  auVar47._2_2_ = uVar99;
  auVar47._0_2_ = uVar99;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar52) + 6);
  uVar99 = (undefined2)(uVar17 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar17;
  auVar91._12_2_ = uVar99;
  auVar91._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar17 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar17;
  auVar90._10_2_ = uVar99;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar99;
  auVar89._0_8_ = uVar17;
  uVar99 = (undefined2)(uVar17 >> 0x10);
  auVar48._4_8_ = auVar89._8_8_;
  auVar48._2_2_ = uVar99;
  auVar48._0_2_ = uVar99;
  fVar157 = (float)(auVar48._0_4_ >> 0x10);
  fVar212 = (float)(auVar89._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar52 * 0x23 + 6);
  uVar99 = (undefined2)(uVar52 >> 0x30);
  auVar263._8_4_ = 0;
  auVar263._0_8_ = uVar52;
  auVar263._12_2_ = uVar99;
  auVar263._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar52 >> 0x20);
  auVar262._12_4_ = auVar263._12_4_;
  auVar262._8_2_ = 0;
  auVar262._0_8_ = uVar52;
  auVar262._10_2_ = uVar99;
  auVar261._10_6_ = auVar262._10_6_;
  auVar261._8_2_ = uVar99;
  auVar261._0_8_ = uVar52;
  uVar99 = (undefined2)(uVar52 >> 0x10);
  auVar49._4_8_ = auVar261._8_8_;
  auVar49._2_2_ = uVar99;
  auVar49._0_2_ = uVar99;
  auVar148._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar125) * fVar242 + fVar125) - fVar279) *
                fVar102,((((float)(int)(short)uVar56 - (float)(int)(short)uVar60) * fVar242 +
                         (float)(int)(short)uVar60) - fVar274) * fVar139);
  auVar148._8_4_ =
       ((((float)(auVar145._8_4_ >> 0x10) - fVar178) * fVar242 + fVar178) - fVar280) * fVar160;
  auVar148._12_4_ =
       ((((float)(auVar146._12_4_ >> 0x10) - (float)(auVar75._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar75._12_4_ >> 0x10)) - fVar281) * fVar213;
  auVar218._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar242 +
        (float)(int)(short)uVar10) - fVar274) * fVar139;
  auVar218._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar130) * fVar242 + fVar130) - fVar279) * fVar102;
  auVar218._8_4_ =
       ((((float)(auVar215._8_4_ >> 0x10) - fVar201) * fVar242 + fVar201) - fVar280) * fVar160;
  auVar218._12_4_ =
       ((((float)(auVar216._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar281) * fVar213;
  auVar231._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar137) * fVar242 + fVar137) - fVar234) *
                fVar105,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar242 +
                         (float)(int)(short)uVar12) - fVar227) * fVar70);
  auVar231._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar203) * fVar242 + fVar203) - fVar235) * fVar173;
  auVar231._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar273) * fVar220;
  auVar241._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar61) * fVar242 +
        (float)(int)(short)uVar61) - fVar227) * fVar70;
  auVar241._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar142) * fVar242 + fVar142) - fVar234) * fVar105;
  auVar241._8_4_ =
       ((((float)(auVar238._8_4_ >> 0x10) - fVar206) * fVar242 + fVar206) - fVar235) * fVar173;
  auVar241._12_4_ =
       ((((float)(auVar239._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar273) * fVar220;
  auVar252._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar155) * fVar242 + fVar155) - fVar225) *
                fVar123,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar242 +
                         (float)(int)(short)uVar15) - fVar222) * fVar100);
  auVar252._8_4_ =
       ((((float)(auVar249._8_4_ >> 0x10) - fVar211) * fVar242 + fVar211) - fVar226) * fVar175;
  auVar252._12_4_ =
       ((((float)(auVar250._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar236) * fVar221;
  auVar264._0_4_ =
       ((((float)(int)(short)uVar52 - (float)(int)(short)uVar17) * fVar242 +
        (float)(int)(short)uVar17) - fVar222) * fVar100;
  auVar264._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar157) * fVar242 + fVar157) - fVar225) * fVar123;
  auVar264._8_4_ =
       ((((float)(auVar261._8_4_ >> 0x10) - fVar212) * fVar242 + fVar212) - fVar226) * fVar175;
  auVar264._12_4_ =
       ((((float)(auVar262._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar242 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar236) * fVar221;
  auVar132._8_4_ = auVar148._8_4_;
  auVar132._0_8_ = auVar148._0_8_;
  auVar132._12_4_ = auVar148._12_4_;
  auVar133 = minps(auVar132,auVar218);
  auVar92._8_4_ = auVar231._8_4_;
  auVar92._0_8_ = auVar231._0_8_;
  auVar92._12_4_ = auVar231._12_4_;
  auVar73 = minps(auVar92,auVar241);
  auVar133 = maxps(auVar133,auVar73);
  auVar93._8_4_ = auVar252._8_4_;
  auVar93._0_8_ = auVar252._0_8_;
  auVar93._12_4_ = auVar252._12_4_;
  auVar73 = minps(auVar93,auVar264);
  uVar54 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar116._4_4_ = uVar54;
  auVar116._0_4_ = uVar54;
  auVar116._8_4_ = uVar54;
  auVar116._12_4_ = uVar54;
  auVar73 = maxps(auVar73,auVar116);
  auVar73 = maxps(auVar133,auVar73);
  local_48 = auVar73._0_4_ * 0.99999964;
  fStack_44 = auVar73._4_4_ * 0.99999964;
  fStack_40 = auVar73._8_4_ * 0.99999964;
  fStack_3c = auVar73._12_4_ * 0.99999964;
  auVar73 = maxps(auVar148,auVar218);
  auVar133 = maxps(auVar231,auVar241);
  auVar73 = minps(auVar73,auVar133);
  auVar133 = maxps(auVar252,auVar264);
  fVar139 = ray->tfar;
  auVar94._4_4_ = fVar139;
  auVar94._0_4_ = fVar139;
  auVar94._8_4_ = fVar139;
  auVar94._12_4_ = fVar139;
  auVar133 = minps(auVar133,auVar94);
  auVar73 = minps(auVar73,auVar133);
  uVar63 = (uint)(byte)PVar18;
  auVar117._0_4_ = -(uint)(uVar63 != 0 && local_48 <= auVar73._0_4_ * 1.0000004);
  auVar117._4_4_ = -(uint)(1 < uVar63 && fStack_44 <= auVar73._4_4_ * 1.0000004);
  auVar117._8_4_ = -(uint)(2 < uVar63 && fStack_40 <= auVar73._8_4_ * 1.0000004);
  auVar117._12_4_ = -(uint)(3 < uVar63 && fStack_3c <= auVar73._12_4_ * 1.0000004);
  uVar63 = movmskps(uVar63,auVar117);
  local_449 = uVar63 != 0;
  if (local_449) {
    uVar63 = uVar63 & 0xff;
    local_2e8 = mm_lookupmask_ps._0_8_;
    uStack_2e0 = mm_lookupmask_ps._8_8_;
    local_300 = pre;
    local_1a0 = prim;
    do {
      lVar22 = 0;
      if (uVar63 != 0) {
        for (; (uVar63 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      local_308 = (ulong)*(uint *)(local_1a0 + 2);
      local_200 = (ulong)*(uint *)(local_1a0 + lVar22 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[local_308].ptr;
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_200 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      local_3f8 = pGVar19->fnumTimeSegments;
      fVar139 = (pGVar19->time_range).lower;
      fVar70 = (((ray->dir).field_0.m128[3] - fVar139) / ((pGVar19->time_range).upper - fVar139)) *
               local_3f8;
      fVar139 = floorf(fVar70);
      if (local_3f8 + -1.0 <= fVar139) {
        fVar139 = local_3f8 + -1.0;
      }
      fVar100 = 0.0;
      if (0.0 <= fVar139) {
        fVar100 = fVar139;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar57 = (long)(int)fVar100 * 0x38;
      lVar22 = *(long *)(_Var20 + 0x10 + lVar57);
      auVar59 = (undefined1  [8])(lVar22 * uVar60);
      lVar58 = *(long *)(_Var20 + 0x38 + lVar57);
      lVar21 = *(long *)(_Var20 + 0x48 + lVar57);
      pfVar1 = (float *)(lVar58 + uVar60 * lVar21);
      pfVar2 = (float *)(lVar58 + (uVar60 + 1) * lVar21);
      pfVar3 = (float *)(lVar58 + (uVar60 + 2) * lVar21);
      fVar70 = fVar70 - fVar100;
      fVar139 = 1.0 - fVar70;
      pfVar4 = (float *)(lVar58 + lVar21 * (uVar60 + 3));
      lVar58 = *(long *)(_Var20 + lVar57);
      pfVar5 = (float *)((long)&(((Geometry *)auVar59)->super_RefCount)._vptr_RefCount + lVar58);
      pfVar6 = (float *)(lVar58 + lVar22 * (uVar60 + 1));
      local_248 = *pfVar5 * fVar139 + *pfVar1 * fVar70;
      fStack_244 = pfVar5[1] * fVar139 + pfVar1[1] * fVar70;
      fStack_240 = pfVar5[2] * fVar139 + pfVar1[2] * fVar70;
      fStack_23c = pfVar5[3] * fVar139 + pfVar1[3] * fVar70;
      local_88 = *pfVar6 * fVar139 + *pfVar2 * fVar70;
      fStack_84 = pfVar6[1] * fVar139 + pfVar2[1] * fVar70;
      fStack_80 = pfVar6[2] * fVar139 + pfVar2[2] * fVar70;
      fStack_7c = pfVar6[3] * fVar139 + pfVar2[3] * fVar70;
      pfVar1 = (float *)(lVar58 + lVar22 * (uVar60 + 2));
      local_98 = *pfVar1 * fVar139 + *pfVar3 * fVar70;
      fStack_94 = pfVar1[1] * fVar139 + pfVar3[1] * fVar70;
      fStack_90 = pfVar1[2] * fVar139 + pfVar3[2] * fVar70;
      fStack_8c = pfVar1[3] * fVar139 + pfVar3[3] * fVar70;
      pfVar1 = (float *)(lVar58 + lVar22 * (uVar60 + 3));
      local_78 = fVar139 * *pfVar1 + fVar70 * *pfVar4;
      fStack_74 = fVar139 * pfVar1[1] + fVar70 * pfVar4[1];
      fStack_70 = fVar139 * pfVar1[2] + fVar70 * pfVar4[2];
      fStack_6c = fVar139 * pfVar1[3] + fVar70 * pfVar4[3];
      fVar139 = *(float *)&pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
      fVar70 = (ray->org).field_0.m128[0];
      fVar100 = (ray->org).field_0.m128[1];
      fVar102 = (ray->org).field_0.m128[2];
      fVar212 = local_248 - fVar70;
      fVar220 = fStack_244 - fVar100;
      fVar227 = fStack_240 - fVar102;
      fVar105 = (local_300->ray_space).vx.field_0.m128[0];
      fVar123 = (local_300->ray_space).vx.field_0.m128[1];
      fVar125 = (local_300->ray_space).vx.field_0.m128[2];
      fVar130 = (local_300->ray_space).vx.field_0.m128[3];
      fVar137 = (local_300->ray_space).vy.field_0.m128[0];
      fVar142 = (local_300->ray_space).vy.field_0.m128[1];
      fVar155 = (local_300->ray_space).vy.field_0.m128[2];
      fVar157 = (local_300->ray_space).vy.field_0.m128[3];
      fVar160 = (local_300->ray_space).vz.field_0.m128[0];
      fVar173 = (local_300->ray_space).vz.field_0.m128[1];
      fVar175 = (local_300->ray_space).vz.field_0.m128[2];
      fVar178 = (local_300->ray_space).vz.field_0.m128[3];
      local_58 = fVar212 * fVar105 + fVar220 * fVar137 + fVar227 * fVar160;
      local_68 = fVar212 * fVar123 + fVar220 * fVar142 + fVar227 * fVar173;
      fVar206 = fVar212 * fVar125 + fVar220 * fVar155 + fVar227 * fVar175;
      fVar213 = local_88 - fVar70;
      fVar221 = fStack_84 - fVar100;
      fVar234 = fStack_80 - fVar102;
      fVar201 = fVar213 * fVar105 + fVar221 * fVar137 + fVar234 * fVar160;
      fVar225 = fVar213 * fVar123 + fVar221 * fVar142 + fVar234 * fVar173;
      fVar203 = fVar213 * fVar125 + fVar221 * fVar155 + fVar234 * fVar175;
      fVar235 = local_98 - fVar70;
      fVar273 = fStack_94 - fVar100;
      fVar222 = fStack_90 - fVar102;
      local_378 = fVar235 * fVar105 + fVar273 * fVar137 + fVar222 * fVar160;
      local_348 = fVar235 * fVar123 + fVar273 * fVar142 + fVar222 * fVar173;
      fVar211 = fVar235 * fVar125 + fVar273 * fVar155 + fVar222 * fVar175;
      fVar70 = local_78 - fVar70;
      fVar100 = fStack_74 - fVar100;
      fVar102 = fStack_70 - fVar102;
      local_338 = fVar70 * fVar105 + fVar100 * fVar137 + fVar102 * fVar160;
      fVar137 = fVar70 * fVar123 + fVar100 * fVar142 + fVar102 * fVar173;
      fVar123 = fVar70 * fVar125 + fVar100 * fVar155 + fVar102 * fVar175;
      auVar149._0_8_ = CONCAT44(local_68,local_58) & 0x7fffffff7fffffff;
      auVar149._8_4_ = ABS(fVar206);
      auVar149._12_4_ = ABS(fStack_23c);
      auVar162._0_8_ = CONCAT44(fVar225,fVar201) & 0x7fffffff7fffffff;
      auVar162._8_4_ = ABS(fVar203);
      auVar162._12_4_ = ABS(fStack_7c);
      auVar73 = maxps(auVar149,auVar162);
      auVar196._0_8_ = CONCAT44(local_348,local_378) & 0x7fffffff7fffffff;
      auVar196._8_4_ = ABS(fVar211);
      auVar196._12_4_ = ABS(fStack_8c);
      auVar118._0_8_ = CONCAT44(fVar137,local_338) & 0x7fffffff7fffffff;
      auVar118._8_4_ = ABS(fVar123);
      auVar118._12_4_ = ABS(fStack_6c);
      auVar133 = maxps(auVar196,auVar118);
      auVar73 = maxps(auVar73,auVar133);
      fVar105 = auVar73._4_4_;
      if (auVar73._4_4_ <= auVar73._0_4_) {
        fVar105 = auVar73._0_4_;
      }
      auVar150._8_8_ = auVar73._8_8_;
      auVar150._0_8_ = auVar73._8_8_;
      fVar125 = (float)(int)fVar139;
      _local_1f8 = ZEXT416((uint)fVar125);
      if (auVar73._8_4_ <= fVar105) {
        auVar150._0_4_ = fVar105;
      }
      local_388._4_4_ = -(uint)(1.0 < fVar125);
      local_388._0_4_ = -(uint)(0.0 < fVar125);
      uStack_380._0_4_ = (float)-(uint)(2.0 < fVar125);
      uStack_380._4_4_ = (float)-(uint)(3.0 < fVar125);
      pRVar55 = (RTCIntersectArguments *)((long)(int)fVar139 * 0x40);
      lVar22 = (long)(int)fVar139 * 0x44;
      fVar142 = *(float *)(bspline_basis0 + lVar22 + 0x908);
      fVar155 = *(float *)(bspline_basis0 + lVar22 + 0x90c);
      fVar160 = *(float *)(bspline_basis0 + lVar22 + 0x910);
      fVar173 = *(float *)(bspline_basis0 + lVar22 + 0x914);
      fVar175 = *(float *)(bspline_basis0 + lVar22 + 0xd8c);
      fVar226 = *(float *)(bspline_basis0 + lVar22 + 0xd90);
      fVar236 = *(float *)(bspline_basis0 + lVar22 + 0xd94);
      fVar242 = *(float *)(bspline_basis0 + lVar22 + 0xd98);
      local_328 = *(float *)(bspline_basis0 + lVar22 + 0x484);
      fStack_324 = *(float *)(bspline_basis0 + lVar22 + 0x488);
      fStack_320 = *(float *)(bspline_basis0 + lVar22 + 0x48c);
      fStack_31c = *(float *)(bspline_basis0 + lVar22 + 0x490);
      local_268 = *(float *)(bspline_basis0 + lVar22);
      fStack_264 = *(float *)(bspline_basis0 + lVar22 + 4);
      fStack_260 = *(float *)(bspline_basis0 + lVar22 + 8);
      fStack_25c = *(float *)(bspline_basis0 + lVar22 + 0xc);
      local_318._0_4_ =
           local_58 * local_268 + fVar201 * local_328 + local_378 * fVar142 + local_338 * fVar175;
      local_318._4_4_ =
           local_58 * fStack_264 + fVar201 * fStack_324 + local_378 * fVar155 + local_338 * fVar226;
      fStack_310 = local_58 * fStack_260 +
                   fVar201 * fStack_320 + local_378 * fVar160 + local_338 * fVar236;
      fStack_30c = local_58 * fStack_25c +
                   fVar201 * fStack_31c + local_378 * fVar173 + local_338 * fVar242;
      fVar179 = local_68 * local_268 + fVar225 * local_328 + local_348 * fVar142 + fVar137 * fVar175
      ;
      fVar202 = local_68 * fStack_264 +
                fVar225 * fStack_324 + local_348 * fVar155 + fVar137 * fVar226;
      fVar204 = local_68 * fStack_260 +
                fVar225 * fStack_320 + local_348 * fVar160 + fVar137 * fVar236;
      fVar205 = local_68 * fStack_25c +
                fVar225 * fStack_31c + local_348 * fVar173 + fVar137 * fVar242;
      fVar258 = fStack_23c * local_268 +
                fStack_7c * local_328 + fStack_8c * fVar142 + fStack_6c * fVar175;
      fVar268 = fStack_23c * fStack_264 +
                fStack_7c * fStack_324 + fStack_8c * fVar155 + fStack_6c * fVar226;
      local_3e8 = (undefined1  [8])CONCAT44(fVar268,fVar258);
      uStack_3e0._0_4_ =
           fStack_23c * fStack_260 +
           fStack_7c * fStack_320 + fStack_8c * fVar160 + fStack_6c * fVar236;
      register0x0000150c =
           fStack_23c * fStack_25c +
           fStack_7c * fStack_31c + fStack_8c * fVar173 + fStack_6c * fVar242;
      fVar244 = *(float *)(bspline_basis1 + lVar22 + 0xd8c);
      fVar247 = *(float *)(bspline_basis1 + lVar22 + 0xd90);
      local_3a8 = *(RTCIntersectArguments **)(bspline_basis1 + lVar22 + 0xd8c);
      fStack_3a0 = *(float *)(bspline_basis1 + lVar22 + 0xd94);
      fStack_39c = *(float *)(bspline_basis1 + lVar22 + 0xd98);
      fVar254 = *(float *)(bspline_basis1 + lVar22 + 0x908);
      fVar255 = *(float *)(bspline_basis1 + lVar22 + 0x90c);
      fVar256 = *(float *)(bspline_basis1 + lVar22 + 0x910);
      fVar257 = *(float *)(bspline_basis1 + lVar22 + 0x914);
      local_b8 = fStack_6c;
      fStack_b4 = fStack_6c;
      fStack_b0 = fStack_6c;
      fStack_ac = fStack_6c;
      local_a8 = fStack_8c;
      fStack_a4 = fStack_8c;
      fStack_a0 = fStack_8c;
      fStack_9c = fStack_8c;
      fVar267 = *(float *)(bspline_basis1 + lVar22 + 0x484);
      fVar271 = *(float *)(bspline_basis1 + lVar22 + 0x488);
      fVar272 = *(float *)(bspline_basis1 + lVar22 + 0x48c);
      fVar274 = *(float *)(bspline_basis1 + lVar22 + 0x490);
      local_c8 = fStack_7c;
      fStack_c4 = fStack_7c;
      fStack_c0 = fStack_7c;
      fStack_bc = fStack_7c;
      fVar279 = *(float *)(bspline_basis1 + lVar22);
      fVar280 = *(float *)(bspline_basis1 + lVar22 + 4);
      fVar281 = *(float *)(bspline_basis1 + lVar22 + 8);
      fVar126 = *(float *)(bspline_basis1 + lVar22 + 0xc);
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      local_3c8 = local_58 * fVar279 + fVar201 * fVar267 + local_378 * fVar254 + local_338 * fVar244
      ;
      fStack_3c4 = local_58 * fVar280 +
                   fVar201 * fVar271 + local_378 * fVar255 + local_338 * fVar247;
      fStack_3c0 = local_58 * fVar281 +
                   fVar201 * fVar272 + local_378 * fVar256 + local_338 * fStack_3a0;
      fStack_3bc = local_58 * fVar126 +
                   fVar201 * fVar274 + local_378 * fVar257 + local_338 * fStack_39c;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      local_3d8._0_4_ =
           local_68 * fVar279 + fVar225 * fVar267 + local_348 * fVar254 + fVar137 * fVar244;
      local_3d8._4_4_ =
           local_68 * fVar280 + fVar225 * fVar271 + local_348 * fVar255 + fVar137 * fVar247;
      uStack_3d0._0_4_ =
           local_68 * fVar281 + fVar225 * fVar272 + local_348 * fVar256 + fVar137 * fStack_3a0;
      uStack_3d0._4_4_ =
           local_68 * fVar126 + fVar225 * fVar274 + local_348 * fVar257 + fVar137 * fStack_39c;
      local_d8 = fStack_23c;
      fStack_d4 = fStack_23c;
      fStack_d0 = fStack_23c;
      fStack_cc = fStack_23c;
      auVar232._0_4_ =
           fStack_23c * fVar279 + fStack_7c * fVar267 + fStack_8c * fVar254 + fStack_6c * fVar244;
      auVar232._4_4_ =
           fStack_23c * fVar280 + fStack_7c * fVar271 + fStack_8c * fVar255 + fStack_6c * fVar247;
      auVar232._8_4_ =
           fStack_23c * fVar281 + fStack_7c * fVar272 + fStack_8c * fVar256 + fStack_6c * fStack_3a0
      ;
      auVar232._12_4_ =
           fStack_23c * fVar126 + fStack_7c * fVar274 + fStack_8c * fVar257 + fStack_6c * fStack_39c
      ;
      fVar161 = local_3c8 - (float)local_318._0_4_;
      fVar174 = fStack_3c4 - (float)local_318._4_4_;
      fVar176 = fStack_3c0 - fStack_310;
      fVar177 = fStack_3bc - fStack_30c;
      fVar71 = (float)local_3d8._0_4_ - fVar179;
      fVar101 = (float)local_3d8._4_4_ - fVar202;
      fVar103 = (float)uStack_3d0 - fVar204;
      fVar104 = uStack_3d0._4_4_ - fVar205;
      local_258 = CONCAT44(fVar202,fVar179);
      uStack_250 = CONCAT44(fVar205,fVar204);
      fVar105 = fVar179 * fVar161 - (float)local_318._0_4_ * fVar71;
      fVar289 = fVar202 * fVar174 - (float)local_318._4_4_ * fVar101;
      fVar291 = fVar204 * fVar176 - fStack_310 * fVar103;
      fVar293 = fVar205 * fVar177 - fStack_30c * fVar104;
      auVar223._8_4_ = (float)uStack_3e0;
      auVar223._0_8_ = local_3e8;
      auVar223._12_4_ = register0x0000150c;
      auVar73 = maxps(auVar223,auVar232);
      bVar24 = fVar105 * fVar105 <=
               auVar73._0_4_ * auVar73._0_4_ * (fVar161 * fVar161 + fVar71 * fVar71) &&
               0.0 < fVar125;
      local_358 = (float)-(uint)bVar24;
      bVar25 = fVar289 * fVar289 <=
               auVar73._4_4_ * auVar73._4_4_ * (fVar174 * fVar174 + fVar101 * fVar101) &&
               1.0 < fVar125;
      fStack_354 = (float)-(uint)bVar25;
      bVar23 = fVar291 * fVar291 <=
               auVar73._8_4_ * auVar73._8_4_ * (fVar176 * fVar176 + fVar103 * fVar103) &&
               2.0 < fVar125;
      fStack_350 = (float)-(uint)bVar23;
      bVar62 = fVar293 * fVar293 <=
               auVar73._12_4_ * auVar73._12_4_ * (fVar177 * fVar177 + fVar104 * fVar104) &&
               3.0 < fVar125;
      fStack_34c = (float)-(uint)bVar62;
      local_2b8 = auVar150._0_4_;
      fStack_2b4 = auVar150._4_4_;
      fStack_2b0 = auVar150._8_4_;
      fStack_2ac = auVar150._12_4_;
      local_2b8 = local_2b8 * 4.7683716e-07;
      auVar26._4_4_ = fStack_354;
      auVar26._0_4_ = local_358;
      auVar26._8_4_ = fStack_350;
      auVar26._12_4_ = fStack_34c;
      iVar51 = movmskps(fVar139,auVar26);
      fVar105 = (ray->org).field_0.m128[3];
      _local_1e8 = ZEXT416((uint)fVar105);
      fVar289 = fVar201;
      fVar291 = fVar201;
      fVar293 = fVar201;
      fVar259 = fVar123;
      fVar269 = fVar123;
      fVar270 = fVar123;
      fVar106 = fVar203;
      fVar124 = fVar203;
      fVar127 = fVar203;
      fVar129 = fVar206;
      fVar131 = fVar206;
      fVar138 = fVar206;
      fVar140 = fVar211;
      fVar141 = fVar211;
      fVar207 = fVar211;
      local_408 = fVar201;
      fStack_404 = fVar201;
      fStack_400 = fVar201;
      fStack_3fc = fVar201;
      fStack_3f0 = fVar206;
      fStack_3b0 = fVar203;
      fStack_390 = fVar123;
      fStack_374 = local_378;
      fStack_370 = local_378;
      fStack_36c = local_378;
      fStack_360 = fVar211;
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      if (iVar51 == 0) {
        bVar62 = false;
        fStack_3f4 = local_68;
        fStack_3ec = fVar212 * fVar130 + fVar220 * fVar157 + fVar227 * fVar178;
        local_3b8 = fVar201;
        fStack_3b4 = fVar225;
        fStack_3ac = fVar213 * fVar130 + fVar221 * fVar157 + fVar234 * fVar178;
        local_398 = local_338;
        fStack_394 = fVar137;
        fStack_38c = fVar70 * fVar130 + fVar100 * fVar157 + fVar102 * fVar178;
        local_368 = local_378;
        fStack_364 = local_348;
        fStack_35c = fVar235 * fVar130 + fVar273 * fVar157 + fVar222 * fVar178;
        local_358 = fVar142;
        fStack_354 = fVar155;
        fStack_350 = fVar160;
        fStack_34c = fVar173;
      }
      else {
        fVar279 = fVar244 * fVar123 + fVar254 * fVar211 + fVar267 * fVar203 + fVar279 * fVar206;
        fVar280 = fVar247 * fVar123 + fVar255 * fVar211 + fVar271 * fVar203 + fVar280 * fVar206;
        fStack_3a0 = fStack_3a0 * fVar123 + fVar256 * fVar211 + fVar272 * fVar203 +
                     fVar281 * fVar206;
        fStack_39c = fStack_39c * fVar123 + fVar257 * fVar211 + fVar274 * fVar203 +
                     fVar126 * fVar206;
        local_3a8 = (RTCIntersectArguments *)CONCAT44(fVar280,fVar279);
        fVar274 = fVar175 * fVar123 + fVar142 * fVar211 + local_328 * fVar203 + local_268 * fVar206;
        fVar281 = fVar226 * fVar123 + fVar155 * fVar211 + fStack_324 * fVar203 +
                  fStack_264 * fVar206;
        fVar126 = fVar236 * fVar123 + fVar160 * fVar211 + fStack_320 * fVar203 +
                  fStack_260 * fVar206;
        fVar128 = fVar242 * fVar123 + fVar173 * fVar211 + fStack_31c * fVar203 +
                  fStack_25c * fVar206;
        fVar70 = *(float *)(bspline_basis0 + lVar22 + 0x1210);
        fVar100 = *(float *)(bspline_basis0 + lVar22 + 0x1214);
        fVar102 = *(float *)(bspline_basis0 + lVar22 + 0x1218);
        fVar130 = *(float *)(bspline_basis0 + lVar22 + 0x121c);
        fVar142 = *(float *)(bspline_basis0 + lVar22 + 0x1694);
        fVar155 = *(float *)(bspline_basis0 + lVar22 + 0x1698);
        fVar157 = *(float *)(bspline_basis0 + lVar22 + 0x169c);
        fVar160 = *(float *)(bspline_basis0 + lVar22 + 0x16a0);
        fVar173 = *(float *)(bspline_basis0 + lVar22 + 0x1b18);
        fVar175 = *(float *)(bspline_basis0 + lVar22 + 0x1b1c);
        fVar178 = *(float *)(bspline_basis0 + lVar22 + 0x1b20);
        fVar212 = *(float *)(bspline_basis0 + lVar22 + 0x1b24);
        fVar213 = *(float *)(bspline_basis0 + lVar22 + 0x1f9c);
        fVar220 = *(float *)(bspline_basis0 + lVar22 + 0x1fa0);
        fVar221 = *(float *)(bspline_basis0 + lVar22 + 0x1fa4);
        fVar227 = *(float *)(bspline_basis0 + lVar22 + 0x1fa8);
        fVar237 = local_58 * fVar70 + fVar201 * fVar142 + local_378 * fVar173 + local_338 * fVar213;
        fVar243 = local_58 * fVar100 + fVar201 * fVar155 + local_378 * fVar175 + local_338 * fVar220
        ;
        fVar245 = local_58 * fVar102 + fVar201 * fVar157 + local_378 * fVar178 + local_338 * fVar221
        ;
        fVar246 = local_58 * fVar130 + fVar201 * fVar160 + local_378 * fVar212 + local_338 * fVar227
        ;
        fVar288 = local_68 * fVar70 + fVar225 * fVar142 + local_348 * fVar173 + fVar137 * fVar213;
        fVar290 = local_68 * fVar100 + fVar225 * fVar155 + local_348 * fVar175 + fVar137 * fVar220;
        fVar292 = local_68 * fVar102 + fVar225 * fVar157 + local_348 * fVar178 + fVar137 * fVar221;
        fVar294 = local_68 * fVar130 + fVar225 * fVar160 + local_348 * fVar212 + fVar137 * fVar227;
        fVar234 = *(float *)(bspline_basis1 + lVar22 + 0x1210);
        fVar235 = *(float *)(bspline_basis1 + lVar22 + 0x1214);
        fVar273 = *(float *)(bspline_basis1 + lVar22 + 0x1218);
        fVar222 = *(float *)(bspline_basis1 + lVar22 + 0x121c);
        fVar226 = *(float *)(bspline_basis1 + lVar22 + 0x1b18);
        fVar236 = *(float *)(bspline_basis1 + lVar22 + 0x1b1c);
        fVar242 = *(float *)(bspline_basis1 + lVar22 + 0x1b20);
        fVar244 = *(float *)(bspline_basis1 + lVar22 + 0x1b24);
        fVar247 = *(float *)(bspline_basis1 + lVar22 + 0x1f9c);
        fVar254 = *(float *)(bspline_basis1 + lVar22 + 0x1fa0);
        fVar255 = *(float *)(bspline_basis1 + lVar22 + 0x1fa4);
        fVar256 = *(float *)(bspline_basis1 + lVar22 + 0x1fa8);
        auVar163._0_4_ = local_338 * fVar247;
        auVar163._4_4_ = local_338 * fVar254;
        auVar163._8_4_ = local_338 * fVar255;
        auVar163._12_4_ = local_338 * fVar256;
        fVar257 = *(float *)(bspline_basis1 + lVar22 + 0x1694);
        fVar267 = *(float *)(bspline_basis1 + lVar22 + 0x1698);
        fVar271 = *(float *)(bspline_basis1 + lVar22 + 0x169c);
        fVar272 = *(float *)(bspline_basis1 + lVar22 + 0x16a0);
        fVar282 = local_58 * fVar234 + fVar201 * fVar257 + local_378 * fVar226 + auVar163._0_4_;
        fVar285 = local_58 * fVar235 + fVar201 * fVar267 + local_378 * fVar236 + auVar163._4_4_;
        fVar286 = local_58 * fVar273 + fVar201 * fVar271 + local_378 * fVar242 + auVar163._8_4_;
        fVar287 = local_58 * fVar222 + fVar201 * fVar272 + local_378 * fVar244 + auVar163._12_4_;
        fVar143 = local_68 * fVar234 + fVar225 * fVar257 + local_348 * fVar226 + fVar137 * fVar247;
        fVar156 = local_68 * fVar235 + fVar225 * fVar267 + local_348 * fVar236 + fVar137 * fVar254;
        fVar158 = local_68 * fVar273 + fVar225 * fVar271 + local_348 * fVar242 + fVar137 * fVar255;
        fVar159 = local_68 * fVar222 + fVar225 * fVar272 + local_348 * fVar244 + fVar137 * fVar256;
        auVar265._0_8_ = CONCAT44(fVar243,fVar237) & 0x7fffffff7fffffff;
        auVar265._8_4_ = ABS(fVar245);
        auVar265._12_4_ = ABS(fVar246);
        auVar224._0_8_ = CONCAT44(fVar290,fVar288) & 0x7fffffff7fffffff;
        auVar224._8_4_ = ABS(fVar292);
        auVar224._12_4_ = ABS(fVar294);
        auVar73 = maxps(auVar265,auVar224);
        auVar275._0_8_ =
             CONCAT44(fVar100 * fVar206 + fVar155 * fVar203 + fVar175 * fVar211 + fVar220 * fVar123,
                      fVar70 * fVar206 + fVar142 * fVar203 + fVar173 * fVar211 + fVar213 * fVar123)
             & 0x7fffffff7fffffff;
        auVar275._8_4_ =
             ABS(fVar102 * fVar206 + fVar157 * fVar203 + fVar178 * fVar211 + fVar221 * fVar123);
        auVar275._12_4_ =
             ABS(fVar130 * fVar206 + fVar160 * fVar203 + fVar212 * fVar211 + fVar227 * fVar123);
        auVar73 = maxps(auVar73,auVar275);
        uVar64 = -(uint)(local_2b8 <= auVar73._0_4_);
        uVar65 = -(uint)(local_2b8 <= auVar73._4_4_);
        uVar66 = -(uint)(local_2b8 <= auVar73._8_4_);
        uVar67 = -(uint)(local_2b8 <= auVar73._12_4_);
        fVar173 = (float)((uint)fVar237 & uVar64 | ~uVar64 & (uint)fVar161);
        fVar175 = (float)((uint)fVar243 & uVar65 | ~uVar65 & (uint)fVar174);
        fVar178 = (float)((uint)fVar245 & uVar66 | ~uVar66 & (uint)fVar176);
        fVar212 = (float)((uint)fVar246 & uVar67 | ~uVar67 & (uint)fVar177);
        fVar213 = (float)(~uVar64 & (uint)fVar71 | (uint)fVar288 & uVar64);
        fVar220 = (float)(~uVar65 & (uint)fVar101 | (uint)fVar290 & uVar65);
        fVar221 = (float)(~uVar66 & (uint)fVar103 | (uint)fVar292 & uVar66);
        fVar227 = (float)(~uVar67 & (uint)fVar104 | (uint)fVar294 & uVar67);
        auVar276._0_8_ = CONCAT44(fVar285,fVar282) & 0x7fffffff7fffffff;
        auVar276._8_4_ = ABS(fVar286);
        auVar276._12_4_ = ABS(fVar287);
        auVar233._0_8_ = CONCAT44(fVar156,fVar143) & 0x7fffffff7fffffff;
        auVar233._8_4_ = ABS(fVar158);
        auVar233._12_4_ = ABS(fVar159);
        auVar73 = maxps(auVar276,auVar233);
        auVar209._0_8_ =
             CONCAT44(fVar235 * fVar206 + fVar267 * fVar203 + fVar236 * fVar211 + fVar254 * fVar123,
                      fVar234 * fVar206 + fVar257 * fVar203 + fVar226 * fVar211 + fVar247 * fVar123)
             & 0x7fffffff7fffffff;
        auVar209._8_4_ =
             ABS(fVar273 * fVar206 + fVar271 * fVar203 + fVar242 * fVar211 + fVar255 * fVar123);
        auVar209._12_4_ =
             ABS(fVar222 * fVar206 + fVar272 * fVar203 + fVar244 * fVar211 + fVar256 * fVar123);
        auVar73 = maxps(auVar73,auVar209);
        uVar64 = -(uint)(local_2b8 <= auVar73._0_4_);
        uVar65 = -(uint)(local_2b8 <= auVar73._4_4_);
        uVar66 = -(uint)(local_2b8 <= auVar73._8_4_);
        uVar67 = -(uint)(local_2b8 <= auVar73._12_4_);
        fVar257 = (float)((uint)fVar282 & uVar64 | ~uVar64 & (uint)fVar161);
        fVar267 = (float)((uint)fVar285 & uVar65 | ~uVar65 & (uint)fVar174);
        fVar271 = (float)((uint)fVar286 & uVar66 | ~uVar66 & (uint)fVar176);
        fVar272 = (float)((uint)fVar287 & uVar67 | ~uVar67 & (uint)fVar177);
        fVar234 = (float)(~uVar64 & (uint)fVar71 | (uint)fVar143 & uVar64);
        fVar235 = (float)(~uVar65 & (uint)fVar101 | (uint)fVar156 & uVar65);
        fVar273 = (float)(~uVar66 & (uint)fVar103 | (uint)fVar158 & uVar66);
        fVar222 = (float)(~uVar67 & (uint)fVar104 | (uint)fVar159 & uVar67);
        auVar119._0_4_ = fVar213 * fVar213 + fVar173 * fVar173;
        auVar119._4_4_ = fVar220 * fVar220 + fVar175 * fVar175;
        auVar119._8_4_ = fVar221 * fVar221 + fVar178 * fVar178;
        auVar119._12_4_ = fVar227 * fVar227 + fVar212 * fVar212;
        auVar73 = rsqrtps(auVar163,auVar119);
        fVar70 = auVar73._0_4_;
        fVar100 = auVar73._4_4_;
        fVar102 = auVar73._8_4_;
        fVar130 = auVar73._12_4_;
        auVar164._0_4_ = fVar70 * fVar70 * auVar119._0_4_ * 0.5 * fVar70;
        auVar164._4_4_ = fVar100 * fVar100 * auVar119._4_4_ * 0.5 * fVar100;
        auVar164._8_4_ = fVar102 * fVar102 * auVar119._8_4_ * 0.5 * fVar102;
        auVar164._12_4_ = fVar130 * fVar130 * auVar119._12_4_ * 0.5 * fVar130;
        fVar226 = fVar70 * 1.5 - auVar164._0_4_;
        fVar236 = fVar100 * 1.5 - auVar164._4_4_;
        fVar242 = fVar102 * 1.5 - auVar164._8_4_;
        fVar244 = fVar130 * 1.5 - auVar164._12_4_;
        auVar120._0_4_ = fVar234 * fVar234 + fVar257 * fVar257;
        auVar120._4_4_ = fVar235 * fVar235 + fVar267 * fVar267;
        auVar120._8_4_ = fVar273 * fVar273 + fVar271 * fVar271;
        auVar120._12_4_ = fVar222 * fVar222 + fVar272 * fVar272;
        auVar73 = rsqrtps(auVar164,auVar120);
        fVar70 = auVar73._0_4_;
        fVar100 = auVar73._4_4_;
        fVar102 = auVar73._8_4_;
        fVar130 = auVar73._12_4_;
        fVar142 = fVar70 * 1.5 - fVar70 * fVar70 * auVar120._0_4_ * 0.5 * fVar70;
        fVar155 = fVar100 * 1.5 - fVar100 * fVar100 * auVar120._4_4_ * 0.5 * fVar100;
        fVar157 = fVar102 * 1.5 - fVar102 * fVar102 * auVar120._8_4_ * 0.5 * fVar102;
        fVar160 = fVar130 * 1.5 - fVar130 * fVar130 * auVar120._12_4_ * 0.5 * fVar130;
        fVar247 = fVar213 * fVar226 * fVar258;
        fVar254 = fVar220 * fVar236 * fVar268;
        fVar255 = fVar221 * fVar242 * (float)uStack_3e0;
        fVar256 = fVar227 * fVar244 * register0x0000150c;
        fVar70 = -fVar173 * fVar226 * fVar258;
        fVar100 = -fVar175 * fVar236 * fVar268;
        fVar102 = -fVar178 * fVar242 * (float)uStack_3e0;
        fVar130 = -fVar212 * fVar244 * register0x0000150c;
        local_268 = fVar179 + fVar70;
        fStack_264 = fVar202 + fVar100;
        fStack_260 = fVar204 + fVar102;
        fStack_25c = fVar205 + fVar130;
        fVar143 = fVar226 * 0.0 * fVar258;
        fVar156 = fVar236 * 0.0 * fVar268;
        fVar158 = fVar242 * 0.0 * (float)uStack_3e0;
        fVar159 = fVar244 * 0.0 * register0x0000150c;
        local_328 = fVar274 + fVar143;
        fStack_324 = fVar281 + fVar156;
        fStack_320 = fVar126 + fVar158;
        fStack_31c = fVar128 + fVar159;
        fVar161 = fVar234 * fVar142 * auVar232._0_4_;
        fVar174 = fVar235 * fVar155 * auVar232._4_4_;
        fVar176 = fVar273 * fVar157 * auVar232._8_4_;
        fVar177 = fVar222 * fVar160 * auVar232._12_4_;
        fVar226 = local_3c8 + fVar161;
        fVar236 = fStack_3c4 + fVar174;
        fVar242 = fStack_3c0 + fVar176;
        fVar244 = fStack_3bc + fVar177;
        fVar213 = -fVar257 * fVar142 * auVar232._0_4_;
        fVar220 = -fVar267 * fVar155 * auVar232._4_4_;
        fVar221 = -fVar271 * fVar157 * auVar232._8_4_;
        fVar227 = -fVar272 * fVar160 * auVar232._12_4_;
        fVar234 = (float)local_3d8._0_4_ + fVar213;
        fVar235 = (float)local_3d8._4_4_ + fVar220;
        fVar273 = (float)uStack_3d0 + fVar221;
        fVar222 = uStack_3d0._4_4_ + fVar227;
        fVar173 = fVar142 * 0.0 * auVar232._0_4_;
        fVar175 = fVar155 * 0.0 * auVar232._4_4_;
        fVar178 = fVar157 * 0.0 * auVar232._8_4_;
        fVar212 = fVar160 * 0.0 * auVar232._12_4_;
        fVar142 = (float)local_318._0_4_ - fVar247;
        fVar155 = (float)local_318._4_4_ - fVar254;
        fVar157 = fStack_310 - fVar255;
        fVar160 = fStack_30c - fVar256;
        fVar257 = fVar279 + fVar173;
        fVar267 = fVar280 + fVar175;
        fVar271 = fStack_3a0 + fVar178;
        fVar272 = fStack_39c + fVar212;
        fVar179 = fVar179 - fVar70;
        fVar202 = fVar202 - fVar100;
        fVar204 = fVar204 - fVar102;
        fVar205 = fVar205 - fVar130;
        fVar274 = fVar274 - fVar143;
        fVar281 = fVar281 - fVar156;
        fVar126 = fVar126 - fVar158;
        fVar128 = fVar128 - fVar159;
        uVar64 = -(uint)(0.0 < (fVar179 * (fVar257 - fVar274) - fVar274 * (fVar234 - fVar179)) * 0.0
                               + (fVar274 * (fVar226 - fVar142) - (fVar257 - fVar274) * fVar142) *
                                 0.0 + ((fVar234 - fVar179) * fVar142 -
                                       (fVar226 - fVar142) * fVar179));
        uVar65 = -(uint)(0.0 < (fVar202 * (fVar267 - fVar281) - fVar281 * (fVar235 - fVar202)) * 0.0
                               + (fVar281 * (fVar236 - fVar155) - (fVar267 - fVar281) * fVar155) *
                                 0.0 + ((fVar235 - fVar202) * fVar155 -
                                       (fVar236 - fVar155) * fVar202));
        uVar66 = -(uint)(0.0 < (fVar204 * (fVar271 - fVar126) - fVar126 * (fVar273 - fVar204)) * 0.0
                               + (fVar126 * (fVar242 - fVar157) - (fVar271 - fVar126) * fVar157) *
                                 0.0 + ((fVar273 - fVar204) * fVar157 -
                                       (fVar242 - fVar157) * fVar204));
        uVar67 = -(uint)(0.0 < (fVar205 * (fVar272 - fVar128) - fVar128 * (fVar222 - fVar205)) * 0.0
                               + (fVar128 * (fVar244 - fVar160) - (fVar272 - fVar128) * fVar160) *
                                 0.0 + ((fVar222 - fVar205) * fVar160 -
                                       (fVar244 - fVar160) * fVar205));
        local_3c8 = (float)((uint)(local_3c8 - fVar161) & uVar64 |
                           ~uVar64 & (uint)((float)local_318._0_4_ + fVar247));
        fStack_3c4 = (float)((uint)(fStack_3c4 - fVar174) & uVar65 |
                            ~uVar65 & (uint)((float)local_318._4_4_ + fVar254));
        fStack_3c0 = (float)((uint)(fStack_3c0 - fVar176) & uVar66 |
                            ~uVar66 & (uint)(fStack_310 + fVar255));
        fStack_3bc = (float)((uint)(fStack_3bc - fVar177) & uVar67 |
                            ~uVar67 & (uint)(fStack_30c + fVar256));
        local_3d8._0_4_ =
             (uint)((float)local_3d8._0_4_ - fVar213) & uVar64 | ~uVar64 & (uint)local_268;
        local_3d8._4_4_ =
             (uint)((float)local_3d8._4_4_ - fVar220) & uVar65 | ~uVar65 & (uint)fStack_264;
        uStack_3d0._0_4_ =
             (float)((uint)((float)uStack_3d0 - fVar221) & uVar66 | ~uVar66 & (uint)fStack_260);
        uStack_3d0._4_4_ =
             (float)((uint)(uStack_3d0._4_4_ - fVar227) & uVar67 | ~uVar67 & (uint)fStack_25c);
        fVar173 = (float)((uint)(fVar279 - fVar173) & uVar64 | ~uVar64 & (uint)local_328);
        fVar175 = (float)((uint)(fVar280 - fVar175) & uVar65 | ~uVar65 & (uint)fStack_324);
        fVar178 = (float)((uint)(fStack_3a0 - fVar178) & uVar66 | ~uVar66 & (uint)fStack_320);
        fVar212 = (float)((uint)(fStack_39c - fVar212) & uVar67 | ~uVar67 & (uint)fStack_31c);
        fVar213 = (float)((uint)fVar142 & uVar64 | ~uVar64 & (uint)fVar226);
        fVar220 = (float)((uint)fVar155 & uVar65 | ~uVar65 & (uint)fVar236);
        fVar221 = (float)((uint)fVar157 & uVar66 | ~uVar66 & (uint)fVar242);
        fVar227 = (float)((uint)fVar160 & uVar67 | ~uVar67 & (uint)fVar244);
        fVar70 = (float)((uint)fVar179 & uVar64 | ~uVar64 & (uint)fVar234);
        fVar100 = (float)((uint)fVar202 & uVar65 | ~uVar65 & (uint)fVar235);
        fVar102 = (float)((uint)fVar204 & uVar66 | ~uVar66 & (uint)fVar273);
        fVar130 = (float)((uint)fVar205 & uVar67 | ~uVar67 & (uint)fVar222);
        fVar279 = (float)((uint)fVar274 & uVar64 | ~uVar64 & (uint)fVar257);
        fVar280 = (float)((uint)fVar281 & uVar65 | ~uVar65 & (uint)fVar267);
        fVar161 = (float)((uint)fVar126 & uVar66 | ~uVar66 & (uint)fVar271);
        fVar174 = (float)((uint)fVar128 & uVar67 | ~uVar67 & (uint)fVar272);
        fVar247 = (float)((uint)fVar226 & uVar64 | ~uVar64 & (uint)fVar142) - local_3c8;
        fVar254 = (float)((uint)fVar236 & uVar65 | ~uVar65 & (uint)fVar155) - fStack_3c4;
        fVar255 = (float)((uint)fVar242 & uVar66 | ~uVar66 & (uint)fVar157) - fStack_3c0;
        fVar256 = (float)((uint)fVar244 & uVar67 | ~uVar67 & (uint)fVar160) - fStack_3bc;
        fVar234 = (float)((uint)fVar234 & uVar64 | ~uVar64 & (uint)fVar179) - (float)local_3d8._0_4_
        ;
        fVar235 = (float)((uint)fVar235 & uVar65 | ~uVar65 & (uint)fVar202) - (float)local_3d8._4_4_
        ;
        fVar273 = (float)((uint)fVar273 & uVar66 | ~uVar66 & (uint)fVar204) - (float)uStack_3d0;
        fVar222 = (float)((uint)fVar222 & uVar67 | ~uVar67 & (uint)fVar205) - uStack_3d0._4_4_;
        fVar257 = (float)((uint)fVar257 & uVar64 | ~uVar64 & (uint)fVar274) - fVar173;
        fVar267 = (float)((uint)fVar267 & uVar65 | ~uVar65 & (uint)fVar281) - fVar175;
        fVar271 = (float)((uint)fVar271 & uVar66 | ~uVar66 & (uint)fVar126) - fVar178;
        fVar272 = (float)((uint)fVar272 & uVar67 | ~uVar67 & (uint)fVar128) - fVar212;
        fVar202 = local_3c8 - fVar213;
        fVar204 = fStack_3c4 - fVar220;
        fVar205 = fStack_3c0 - fVar221;
        fVar176 = fStack_3bc - fVar227;
        fVar226 = (float)local_3d8._0_4_ - fVar70;
        fVar236 = (float)local_3d8._4_4_ - fVar100;
        fVar242 = (float)uStack_3d0 - fVar102;
        fVar244 = uStack_3d0._4_4_ - fVar130;
        fVar142 = fVar173 - fVar279;
        fVar155 = fVar175 - fVar280;
        fVar157 = fVar178 - fVar161;
        fVar160 = fVar212 - fVar174;
        fVar274 = ((float)local_3d8._0_4_ * fVar257 - fVar173 * fVar234) * 0.0 +
                  (fVar173 * fVar247 - local_3c8 * fVar257) * 0.0 +
                  (local_3c8 * fVar234 - (float)local_3d8._0_4_ * fVar247);
        fVar281 = ((float)local_3d8._4_4_ * fVar267 - fVar175 * fVar235) * 0.0 +
                  (fVar175 * fVar254 - fStack_3c4 * fVar267) * 0.0 +
                  (fStack_3c4 * fVar235 - (float)local_3d8._4_4_ * fVar254);
        auVar151._4_4_ = fVar281;
        auVar151._0_4_ = fVar274;
        fVar126 = ((float)uStack_3d0 * fVar271 - fVar178 * fVar273) * 0.0 +
                  (fVar178 * fVar255 - fStack_3c0 * fVar271) * 0.0 +
                  (fStack_3c0 * fVar273 - (float)uStack_3d0 * fVar255);
        fVar179 = (uStack_3d0._4_4_ * fVar272 - fVar212 * fVar222) * 0.0 +
                  (fVar212 * fVar256 - fStack_3bc * fVar272) * 0.0 +
                  (fStack_3bc * fVar222 - uStack_3d0._4_4_ * fVar256);
        auVar283._0_4_ =
             (fVar70 * fVar142 - fVar279 * fVar226) * 0.0 +
             (fVar279 * fVar202 - fVar213 * fVar142) * 0.0 + (fVar213 * fVar226 - fVar70 * fVar202);
        auVar283._4_4_ =
             (fVar100 * fVar155 - fVar280 * fVar236) * 0.0 +
             (fVar280 * fVar204 - fVar220 * fVar155) * 0.0 + (fVar220 * fVar236 - fVar100 * fVar204)
        ;
        auVar283._8_4_ =
             (fVar102 * fVar157 - fVar161 * fVar242) * 0.0 +
             (fVar161 * fVar205 - fVar221 * fVar157) * 0.0 + (fVar221 * fVar242 - fVar102 * fVar205)
        ;
        auVar283._12_4_ =
             (fVar130 * fVar160 - fVar174 * fVar244) * 0.0 +
             (fVar174 * fVar176 - fVar227 * fVar160) * 0.0 + (fVar227 * fVar244 - fVar130 * fVar176)
        ;
        auVar151._8_4_ = fVar126;
        auVar151._12_4_ = fVar179;
        auVar73 = maxps(auVar151,auVar283);
        bVar24 = auVar73._0_4_ <= 0.0 && bVar24;
        auVar152._0_4_ = -(uint)bVar24;
        bVar25 = auVar73._4_4_ <= 0.0 && bVar25;
        auVar152._4_4_ = -(uint)bVar25;
        bVar23 = auVar73._8_4_ <= 0.0 && bVar23;
        auVar152._8_4_ = -(uint)bVar23;
        bVar62 = auVar73._12_4_ <= 0.0 && bVar62;
        auVar152._12_4_ = -(uint)bVar62;
        iVar51 = movmskps(iVar51,auVar152);
        if (iVar51 == 0) {
          auVar95._8_8_ = uStack_2e0;
          auVar95._0_8_ = local_2e8;
          iVar51 = 0;
        }
        else {
          fVar70 = ray->tfar;
          auVar165._0_4_ = fVar142 * fVar234;
          auVar165._4_4_ = fVar155 * fVar235;
          auVar165._8_4_ = fVar157 * fVar273;
          auVar165._12_4_ = fVar160 * fVar222;
          fVar220 = fVar226 * fVar257 - auVar165._0_4_;
          fVar221 = fVar236 * fVar267 - auVar165._4_4_;
          fVar227 = fVar242 * fVar271 - auVar165._8_4_;
          fVar279 = fVar244 * fVar272 - auVar165._12_4_;
          fVar100 = fVar142 * fVar247 - fVar257 * fVar202;
          fVar130 = fVar155 * fVar254 - fVar267 * fVar204;
          fVar155 = fVar157 * fVar255 - fVar271 * fVar205;
          fVar160 = fVar160 * fVar256 - fVar272 * fVar176;
          fVar234 = fVar202 * fVar234 - fVar226 * fVar247;
          fVar235 = fVar204 * fVar235 - fVar236 * fVar254;
          fVar273 = fVar205 * fVar273 - fVar242 * fVar255;
          fVar222 = fVar176 * fVar222 - fVar244 * fVar256;
          auVar197._0_4_ = fVar220 * 0.0 + fVar100 * 0.0 + fVar234;
          auVar197._4_4_ = fVar221 * 0.0 + fVar130 * 0.0 + fVar235;
          auVar197._8_4_ = fVar227 * 0.0 + fVar155 * 0.0 + fVar273;
          auVar197._12_4_ = fVar279 * 0.0 + fVar160 * 0.0 + fVar222;
          auVar73 = rcpps(auVar165,auVar197);
          fVar102 = auVar73._0_4_;
          fVar142 = auVar73._4_4_;
          fVar157 = auVar73._8_4_;
          fVar213 = auVar73._12_4_;
          fVar102 = (1.0 - auVar197._0_4_ * fVar102) * fVar102 + fVar102;
          fVar142 = (1.0 - auVar197._4_4_ * fVar142) * fVar142 + fVar142;
          fVar157 = (1.0 - auVar197._8_4_ * fVar157) * fVar157 + fVar157;
          fVar213 = (1.0 - auVar197._12_4_ * fVar213) * fVar213 + fVar213;
          fVar100 = (fVar173 * fVar234 + (float)local_3d8._0_4_ * fVar100 + local_3c8 * fVar220) *
                    fVar102;
          fVar130 = (fVar175 * fVar235 + (float)local_3d8._4_4_ * fVar130 + fStack_3c4 * fVar221) *
                    fVar142;
          fVar155 = (fVar178 * fVar273 + (float)uStack_3d0 * fVar155 + fStack_3c0 * fVar227) *
                    fVar157;
          fVar160 = (fVar212 * fVar222 + uStack_3d0._4_4_ * fVar160 + fStack_3bc * fVar279) *
                    fVar213;
          bVar24 = (fVar100 <= fVar70 && fVar105 <= fVar100) && bVar24;
          auVar166._0_4_ = -(uint)bVar24;
          bVar25 = (fVar130 <= fVar70 && fVar105 <= fVar130) && bVar25;
          auVar166._4_4_ = -(uint)bVar25;
          bVar23 = (fVar155 <= fVar70 && fVar105 <= fVar155) && bVar23;
          auVar166._8_4_ = -(uint)bVar23;
          bVar62 = (fVar160 <= fVar70 && fVar105 <= fVar160) && bVar62;
          auVar166._12_4_ = -(uint)bVar62;
          iVar51 = movmskps(iVar51,auVar166);
          if (iVar51 == 0) {
            auVar95._8_8_ = uStack_2e0;
            auVar95._0_8_ = local_2e8;
            iVar51 = 0;
          }
          else {
            auVar167._0_8_ =
                 CONCAT44(-(uint)(auVar197._4_4_ != 0.0 && bVar25),
                          -(uint)(auVar197._0_4_ != 0.0 && bVar24));
            auVar167._8_4_ = -(uint)(auVar197._8_4_ != 0.0 && bVar23);
            auVar167._12_4_ = -(uint)(auVar197._12_4_ != 0.0 && bVar62);
            iVar51 = movmskps(iVar51,auVar167);
            auVar95._8_8_ = uStack_2e0;
            auVar95._0_8_ = local_2e8;
            if (iVar51 != 0) {
              fVar274 = fVar274 * fVar102;
              fVar281 = fVar281 * fVar142;
              fVar126 = fVar126 * fVar157;
              fVar179 = fVar179 * fVar213;
              local_2c8 = (float)((uint)(1.0 - fVar274) & uVar64 | ~uVar64 & (uint)fVar274);
              fStack_2c4 = (float)((uint)(1.0 - fVar281) & uVar65 | ~uVar65 & (uint)fVar281);
              fStack_2c0 = (float)((uint)(1.0 - fVar126) & uVar66 | ~uVar66 & (uint)fVar126);
              fStack_2bc = (float)((uint)(1.0 - fVar179) & uVar67 | ~uVar67 & (uint)fVar179);
              local_1c8 = (float)(~uVar64 & (uint)(auVar283._0_4_ * fVar102) |
                                 (uint)(1.0 - auVar283._0_4_ * fVar102) & uVar64);
              fStack_1c4 = (float)(~uVar65 & (uint)(auVar283._4_4_ * fVar142) |
                                  (uint)(1.0 - auVar283._4_4_ * fVar142) & uVar65);
              fStack_1c0 = (float)(~uVar66 & (uint)(auVar283._8_4_ * fVar157) |
                                  (uint)(1.0 - auVar283._8_4_ * fVar157) & uVar66);
              fStack_1bc = (float)(~uVar67 & (uint)(auVar283._12_4_ * fVar213) |
                                  (uint)(1.0 - auVar283._12_4_ * fVar213) & uVar67);
              auVar95._8_4_ = auVar167._8_4_;
              auVar95._0_8_ = auVar167._0_8_;
              auVar95._12_4_ = auVar167._12_4_;
              local_2d8 = fVar100;
              fStack_2d4 = fVar130;
              fStack_2d0 = fVar155;
              fStack_2cc = fVar160;
            }
          }
        }
        iVar51 = movmskps(iVar51,auVar95);
        fStack_3f4 = fVar206;
        fStack_3ec = fVar206;
        local_3b8 = fVar203;
        fStack_3b4 = fVar203;
        fStack_3ac = fVar203;
        local_398 = fVar123;
        fStack_394 = fVar123;
        fStack_38c = fVar123;
        _local_388 = auVar232;
        local_368 = fVar211;
        fStack_364 = fVar211;
        fStack_35c = fVar211;
        local_1b8 = fVar71;
        fStack_1b4 = fVar101;
        fStack_1b0 = fVar103;
        fStack_1ac = fVar104;
        if (iVar51 == 0) {
          bVar62 = false;
        }
        else {
          fVar258 = (auVar232._0_4_ - fVar258) * local_2c8 + fVar258;
          fVar268 = (auVar232._4_4_ - fVar268) * fStack_2c4 + fVar268;
          fVar100 = (auVar232._8_4_ - (float)uStack_3e0) * fStack_2c0 + (float)uStack_3e0;
          fVar102 = (auVar232._12_4_ - register0x0000150c) * fStack_2bc + register0x0000150c;
          fVar70 = local_300->depth_scale;
          auVar121._0_4_ = -(uint)(fVar70 * (fVar258 + fVar258) < local_2d8) & auVar95._0_4_;
          auVar121._4_4_ = -(uint)(fVar70 * (fVar268 + fVar268) < fStack_2d4) & auVar95._4_4_;
          auVar121._8_4_ = -(uint)(fVar70 * (fVar100 + fVar100) < fStack_2d0) & auVar95._8_4_;
          auVar121._12_4_ = -(uint)(fVar70 * (fVar102 + fVar102) < fStack_2cc) & auVar95._12_4_;
          uVar64 = movmskps((int)local_300,auVar121);
          if (uVar64 != 0) {
            local_1c8 = local_1c8 + local_1c8 + -1.0;
            fStack_1c4 = fStack_1c4 + fStack_1c4 + -1.0;
            fStack_1c0 = fStack_1c0 + fStack_1c0 + -1.0;
            fStack_1bc = fStack_1bc + fStack_1bc + -1.0;
            local_168 = 0;
            local_158 = CONCAT44(fStack_244,local_248);
            uStack_150 = CONCAT44(fStack_23c,fStack_240);
            local_148 = CONCAT44(fStack_84,local_88);
            uStack_140 = CONCAT44(fStack_7c,fStack_80);
            local_138 = CONCAT44(fStack_94,local_98);
            uStack_130 = CONCAT44(fStack_8c,fStack_90);
            local_128 = CONCAT44(fStack_74,local_78);
            uStack_120 = CONCAT44(fStack_6c,fStack_70);
            pRVar55 = (RTCIntersectArguments *)(ulong)(uint)ray->mask;
            local_198 = local_2c8;
            fStack_194 = fStack_2c4;
            fStack_190 = fStack_2c0;
            fStack_18c = fStack_2bc;
            local_188 = local_1c8;
            fStack_184 = fStack_1c4;
            fStack_180 = fStack_1c0;
            fStack_17c = fStack_1bc;
            local_178 = local_2d8;
            fStack_174 = fStack_2d4;
            fStack_170 = fStack_2d0;
            fStack_16c = fStack_2cc;
            local_164 = fVar139;
            local_118 = auVar121;
            if ((pGVar19->mask & ray->mask) != 0) {
              pRVar55 = context->args;
              if ((pRVar55->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar62 = true, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar125 = 1.0 / fVar125;
                local_108[0] = fVar125 * (local_2c8 + 0.0);
                local_108[1] = fVar125 * (fStack_2c4 + 1.0);
                local_108[2] = fVar125 * (fStack_2c0 + 2.0);
                local_108[3] = fVar125 * (fStack_2bc + 3.0);
                local_f8 = CONCAT44(fStack_1c4,local_1c8);
                uStack_f0 = CONCAT44(fStack_1bc,fStack_1c0);
                local_e8[0] = local_2d8;
                local_e8[1] = fStack_2d4;
                local_e8[2] = fStack_2d0;
                local_e8[3] = fStack_2cc;
                auVar59 = (undefined1  [8])(ulong)(uVar64 & 0xff);
                pRVar55 = (RTCIntersectArguments *)0x0;
                if (auVar59 != (undefined1  [8])0x0) {
                  for (; ((uVar64 & 0xff) >> (long)pRVar55 & 1) == 0;
                      pRVar55 = (RTCIntersectArguments *)((long)&pRVar55->flags + 1)) {
                  }
                }
                uStack_3d0 = uStack_140;
                local_3d8 = (undefined1  [8])local_148;
                uStack_3e0 = uStack_130;
                local_3e8 = (undefined1  [8])local_138;
                uStack_380 = uStack_120;
                local_388 = (undefined1  [8])local_128;
                bVar62 = true;
                local_3f8 = fVar206;
                do {
                  local_22c = local_108[(long)pRVar55];
                  local_228 = *(undefined4 *)((long)&local_f8 + (long)pRVar55 * 4);
                  local_3c8 = ray->tfar;
                  ray->tfar = local_e8[(long)pRVar55];
                  local_2a8.context = context->user;
                  fVar102 = 1.0 - local_22c;
                  fVar105 = local_22c * fVar102 * 4.0;
                  fVar70 = -fVar102 * fVar102 * 0.5;
                  fVar100 = (-local_22c * local_22c - fVar105) * 0.5;
                  fVar102 = (fVar102 * fVar102 + fVar105) * 0.5;
                  fVar105 = local_22c * local_22c * 0.5;
                  local_238 = CONCAT44(fVar70 * fStack_244 +
                                       fVar100 * (float)local_3d8._4_4_ +
                                       fVar102 * (float)local_3e8._4_4_ +
                                       fVar105 * (float)local_388._4_4_,
                                       fVar70 * local_248 +
                                       fVar100 * (float)local_3d8._0_4_ +
                                       fVar102 * (float)local_3e8._0_4_ +
                                       fVar105 * (float)local_388._0_4_);
                  local_230 = fVar70 * fStack_240 +
                              fVar100 * (float)uStack_3d0 +
                              fVar102 * (float)uStack_3e0 + fVar105 * (float)uStack_380;
                  local_224 = (undefined4)local_200;
                  local_220 = (undefined4)local_308;
                  local_21c = (local_2a8.context)->instID[0];
                  local_218 = (local_2a8.context)->instPrimID[0];
                  local_40c = -1;
                  local_2a8.valid = &local_40c;
                  local_2a8.geometryUserPtr = pGVar19->userPtr;
                  local_2a8.hit = (RTCHitN *)&local_238;
                  local_2a8.N = 1;
                  local_3a8 = pRVar55;
                  local_2a8.ray = (RTCRayN *)ray;
                  if ((pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar19->occlusionFilterN)(&local_2a8), fVar201 = local_408,
                     fVar289 = fStack_404, fVar291 = fStack_400, fVar293 = fStack_3fc,
                     fVar123 = local_398, fVar259 = fStack_394, fVar269 = fStack_390,
                     fVar270 = fStack_38c, fVar203 = local_3b8, fVar106 = fStack_3b4,
                     fVar124 = fStack_3b0, fVar127 = fStack_3ac, fVar206 = local_3f8,
                     fVar129 = fStack_3f4, fVar131 = fStack_3f0, fVar138 = fStack_3ec,
                     fVar211 = local_368, fVar140 = fStack_364, fVar141 = fStack_360,
                     fVar207 = fStack_35c, *local_2a8.valid != 0)) {
                    pRVar55 = context->args;
                    if (pRVar55->filter == (RTCFilterFunctionN)0x0) break;
                    if (((pRVar55->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                      (*pRVar55->filter)(&local_2a8);
                      fVar201 = local_408;
                      fVar289 = fStack_404;
                      fVar291 = fStack_400;
                      fVar293 = fStack_3fc;
                      fVar123 = local_398;
                      fVar259 = fStack_394;
                      fVar269 = fStack_390;
                      fVar270 = fStack_38c;
                      fVar203 = local_3b8;
                      fVar106 = fStack_3b4;
                      fVar124 = fStack_3b0;
                      fVar127 = fStack_3ac;
                      fVar206 = local_3f8;
                      fVar129 = fStack_3f4;
                      fVar131 = fStack_3f0;
                      fVar138 = fStack_3ec;
                      fVar211 = local_368;
                      fVar140 = fStack_364;
                      fVar141 = fStack_360;
                      fVar207 = fStack_35c;
                    }
                    if (*local_2a8.valid != 0) break;
                  }
                  ray->tfar = local_3c8;
                  auVar59 = (undefined1  [8])((ulong)auVar59 ^ 1L << ((ulong)local_3a8 & 0x3f));
                  pRVar55 = (RTCIntersectArguments *)0x0;
                  if (auVar59 != (undefined1  [8])0x0) {
                    for (; ((ulong)auVar59 >> (long)pRVar55 & 1) == 0;
                        pRVar55 = (RTCIntersectArguments *)((long)&pRVar55->flags + 1)) {
                    }
                  }
                  bVar62 = auVar59 != (undefined1  [8])0x0;
                } while (bVar62);
              }
              goto LAB_00be867c;
            }
          }
          bVar62 = false;
        }
      }
LAB_00be867c:
      uVar54 = SUB84(pRVar55,0);
      if (4 < (int)fVar139) {
        local_1e8._4_4_ = local_1e8._0_4_;
        fStack_1e0 = (float)local_1e8._0_4_;
        fStack_1dc = (float)local_1e8._0_4_;
        local_1f8._4_4_ = 1.0 / (float)local_1f8._0_4_;
        local_1f8._0_4_ = local_1f8._4_4_;
        fStack_1f0 = (float)local_1f8._4_4_;
        fStack_1ec = (float)local_1f8._4_4_;
        lVar58 = 4;
        fStack_2b4 = local_2b8;
        fStack_2b0 = local_2b8;
        fStack_2ac = local_2b8;
        local_3f8 = fVar206;
        fStack_3f4 = fVar129;
        fStack_3f0 = fVar131;
        fStack_3ec = fVar138;
        local_3b8 = fVar203;
        fStack_3b4 = fVar106;
        fStack_3b0 = fVar124;
        fStack_3ac = fVar127;
        local_398 = fVar123;
        fStack_394 = fVar259;
        fStack_390 = fVar269;
        fStack_38c = fVar270;
        local_368 = fVar211;
        fStack_364 = fVar140;
        fStack_360 = fVar141;
        fStack_35c = fVar207;
        local_1b8 = fVar139;
        fStack_1b4 = fVar139;
        fStack_1b0 = fVar139;
        fStack_1ac = fVar139;
        do {
          uVar64 = (uint)lVar58;
          local_3c8 = (float)-(uint)((int)uVar64 < (int)local_1b8);
          bVar23 = (int)(uVar64 | 1) < (int)fStack_1b4;
          fStack_3c4 = (float)-(uint)bVar23;
          bVar24 = (int)(uVar64 | 2) < (int)fStack_1b0;
          fStack_3c0 = (float)-(uint)bVar24;
          bVar25 = (int)(uVar64 | 3) < (int)fStack_1ac;
          fStack_3bc = (float)-(uint)bVar25;
          pRVar55 = (RTCIntersectArguments *)(bspline_basis0 + lVar22);
          pRVar7 = &pRVar55->flags + lVar58;
          fVar70 = (float)*pRVar7;
          fVar100 = (float)pRVar7[1];
          fVar102 = (float)pRVar7[2];
          auVar30 = *(undefined1 (*) [12])pRVar7;
          fVar105 = *(float *)*(undefined1 (*) [12])(pRVar7 + 3);
          pfVar1 = (float *)(lVar22 + 0x222bfac + lVar58 * 4);
          local_358 = *pfVar1;
          fStack_354 = pfVar1[1];
          fStack_350 = pfVar1[2];
          fStack_34c = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222c430 + lVar58 * 4);
          local_328 = *pfVar1;
          fStack_324 = pfVar1[1];
          fStack_320 = pfVar1[2];
          fStack_31c = pfVar1[3];
          pauVar9 = (undefined1 (*) [16])(lVar22 + 0x222c8b4 + lVar58 * 4);
          fVar123 = *(float *)*pauVar9;
          fVar125 = *(float *)(*pauVar9 + 4);
          fVar130 = *(float *)(*pauVar9 + 8);
          auVar29 = *(undefined1 (*) [12])*pauVar9;
          fVar142 = *(float *)(*pauVar9 + 0xc);
          local_388._0_4_ =
               local_58 * fVar70 + fVar201 * local_358 + local_378 * local_328 + local_338 * fVar123
          ;
          local_388._4_4_ =
               fStack_54 * fVar100 +
               fVar289 * fStack_354 + fStack_374 * fStack_324 + fStack_334 * fVar125;
          uStack_380._0_4_ =
               fStack_50 * fVar102 +
               fVar291 * fStack_350 + fStack_370 * fStack_320 + fStack_330 * fVar130;
          uStack_380._4_4_ =
               fStack_4c * fVar105 +
               fVar293 * fStack_34c + fStack_36c * fStack_31c + fStack_32c * fVar142;
          fVar227 = local_68 * fVar70 +
                    fVar225 * local_358 + local_348 * local_328 + fVar137 * fVar123;
          fVar235 = fStack_64 * fVar100 +
                    fVar225 * fStack_354 + fStack_344 * fStack_324 + fVar137 * fVar125;
          fVar222 = fStack_60 * fVar102 +
                    fVar225 * fStack_350 + fStack_340 * fStack_320 + fVar137 * fVar130;
          fVar236 = fStack_5c * fVar105 +
                    fVar225 * fStack_34c + fStack_33c * fStack_31c + fVar137 * fVar142;
          local_3d8._0_4_ =
               local_d8 * fVar70 + local_c8 * local_358 + local_a8 * local_328 + local_b8 * fVar123;
          local_3d8._4_4_ =
               fStack_d4 * fVar100 +
               fStack_c4 * fStack_354 + fStack_a4 * fStack_324 + fStack_b4 * fVar125;
          uStack_3d0._0_4_ =
               fStack_d0 * fVar102 +
               fStack_c0 * fStack_350 + fStack_a0 * fStack_320 + fStack_b0 * fVar130;
          uStack_3d0._4_4_ =
               fStack_cc * fVar105 +
               fStack_bc * fStack_34c + fStack_9c * fStack_31c + fStack_ac * fVar142;
          pfVar1 = (float *)(bspline_basis1 + lVar22 + lVar58 * 4);
          fVar70 = *pfVar1;
          fVar100 = pfVar1[1];
          fVar102 = pfVar1[2];
          fVar123 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222e3cc + lVar58 * 4);
          fVar125 = *pfVar1;
          fVar130 = pfVar1[1];
          fVar155 = pfVar1[2];
          fVar157 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222e850 + lVar58 * 4);
          fVar160 = *pfVar1;
          fVar173 = pfVar1[1];
          fVar175 = pfVar1[2];
          fVar178 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222ecd4 + lVar58 * 4);
          fVar203 = *pfVar1;
          fVar206 = pfVar1[1];
          fVar211 = pfVar1[2];
          fVar212 = pfVar1[3];
          fVar267 = local_58 * fVar70 +
                    fVar201 * fVar125 + local_378 * fVar160 + local_338 * fVar203;
          fVar271 = fStack_54 * fVar100 +
                    fVar289 * fVar130 + fStack_374 * fVar173 + fStack_334 * fVar206;
          fVar272 = fStack_50 * fVar102 +
                    fVar291 * fVar155 + fStack_370 * fVar175 + fStack_330 * fVar211;
          fVar274 = fStack_4c * fVar123 +
                    fVar293 * fVar157 + fStack_36c * fVar178 + fStack_32c * fVar212;
          fVar244 = local_68 * fVar70 + fVar225 * fVar125 + local_348 * fVar160 + fVar137 * fVar203;
          fVar247 = fStack_64 * fVar100 +
                    fVar225 * fVar130 + fStack_344 * fVar173 + fVar137 * fVar206;
          fStack_3a0 = fStack_60 * fVar102 +
                       fVar225 * fVar155 + fStack_340 * fVar175 + fVar137 * fVar211;
          fStack_39c = fStack_5c * fVar123 +
                       fVar225 * fVar157 + fStack_33c * fVar178 + fVar137 * fVar212;
          auVar168._0_4_ =
               local_d8 * fVar70 + local_c8 * fVar125 + local_a8 * fVar160 + local_b8 * fVar203;
          auVar168._4_4_ =
               fStack_d4 * fVar100 + fStack_c4 * fVar130 + fStack_a4 * fVar173 + fStack_b4 * fVar206
          ;
          auVar168._8_4_ =
               fStack_d0 * fVar102 + fStack_c0 * fVar155 + fStack_a0 * fVar175 + fStack_b0 * fVar211
          ;
          auVar168._12_4_ =
               fStack_cc * fVar123 + fStack_bc * fVar157 + fStack_9c * fVar178 + fStack_ac * fVar212
          ;
          fVar201 = fVar267 - (float)local_388._0_4_;
          fVar213 = fVar271 - (float)local_388._4_4_;
          fVar220 = fVar272 - (float)uStack_380;
          fVar221 = fVar274 - uStack_380._4_4_;
          local_3a8 = (RTCIntersectArguments *)CONCAT44(fVar247,fVar244);
          fVar254 = fVar244 - fVar227;
          fVar255 = fVar247 - fVar235;
          fVar256 = fStack_3a0 - fVar222;
          fVar257 = fStack_39c - fVar236;
          local_258 = CONCAT44(fVar235,fVar227);
          uStack_250 = CONCAT44(fVar236,fVar222);
          fVar234 = fVar227 * fVar201 - (float)local_388._0_4_ * fVar254;
          fVar273 = fVar235 * fVar213 - (float)local_388._4_4_ * fVar255;
          fVar226 = fVar222 * fVar220 - (float)uStack_380 * fVar256;
          fVar242 = fVar236 * fVar221 - uStack_380._4_4_ * fVar257;
          auVar73 = maxps(_local_3d8,auVar168);
          bVar50 = fVar234 * fVar234 <=
                   auVar73._0_4_ * auVar73._0_4_ * (fVar201 * fVar201 + fVar254 * fVar254) &&
                   (int)uVar64 < (int)local_1b8;
          auVar219._0_4_ = -(uint)bVar50;
          bVar23 = fVar273 * fVar273 <=
                   auVar73._4_4_ * auVar73._4_4_ * (fVar213 * fVar213 + fVar255 * fVar255) && bVar23
          ;
          auVar219._4_4_ = -(uint)bVar23;
          bVar24 = fVar226 * fVar226 <=
                   auVar73._8_4_ * auVar73._8_4_ * (fVar220 * fVar220 + fVar256 * fVar256) && bVar24
          ;
          auVar219._8_4_ = -(uint)bVar24;
          bVar25 = fVar242 * fVar242 <=
                   auVar73._12_4_ * auVar73._12_4_ * (fVar221 * fVar221 + fVar257 * fVar257) &&
                   bVar25;
          auVar219._12_4_ = -(uint)bVar25;
          uVar65 = movmskps(SUB84(auVar59,0),auVar219);
          auVar59 = (undefined1  [8])(ulong)uVar65;
          _local_3e8 = *pauVar9;
          _local_318 = *(undefined1 (*) [16])pRVar7;
          if (uVar65 != 0) {
            fVar106 = fVar203 * local_398 + fVar160 * local_368 + fVar125 * local_3b8 +
                      fVar70 * local_3f8;
            fVar124 = fVar206 * fStack_394 + fVar173 * fStack_364 + fVar130 * fStack_3b4 +
                      fVar100 * fStack_3f4;
            fVar127 = fVar211 * fStack_390 + fVar175 * fStack_360 + fVar155 * fStack_3b0 +
                      fVar102 * fStack_3f0;
            fVar129 = fVar212 * fStack_38c + fVar178 * fStack_35c + fVar157 * fStack_3ac +
                      fVar123 * fStack_3ec;
            local_318._0_4_ = auVar30._0_4_;
            local_318._4_4_ = auVar30._4_4_;
            fStack_310 = auVar30._8_4_;
            local_3e8._0_4_ = auVar29._0_4_;
            local_3e8._4_4_ = auVar29._4_4_;
            uStack_3e0._0_4_ = auVar29._8_4_;
            fVar202 = (float)local_3e8._0_4_ * local_398 + local_328 * local_368 +
                      local_358 * local_3b8 + (float)local_318._0_4_ * local_3f8;
            fVar103 = (float)local_3e8._4_4_ * fStack_394 + fStack_324 * fStack_364 +
                      fStack_354 * fStack_3b4 + (float)local_318._4_4_ * fStack_3f4;
            fVar204 = (float)uStack_3e0 * fStack_390 + fStack_320 * fStack_360 +
                      fStack_350 * fStack_3b0 + fStack_310 * fStack_3f0;
            fVar104 = fVar142 * fStack_38c + fStack_31c * fStack_35c + fStack_34c * fStack_3ac +
                      fVar105 * fStack_3ec;
            pfVar1 = (float *)(lVar22 + 0x222cd38 + lVar58 * 4);
            fVar70 = *pfVar1;
            fVar100 = pfVar1[1];
            fVar102 = pfVar1[2];
            fVar105 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222d1bc + lVar58 * 4);
            fVar123 = *pfVar1;
            fVar125 = pfVar1[1];
            fVar130 = pfVar1[2];
            fVar142 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222d640 + lVar58 * 4);
            fVar155 = *pfVar1;
            fVar157 = pfVar1[1];
            fVar160 = pfVar1[2];
            fVar173 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222dac4 + lVar58 * 4);
            fVar175 = *pfVar1;
            fVar178 = pfVar1[1];
            fVar203 = pfVar1[2];
            fVar206 = pfVar1[3];
            fVar205 = local_58 * fVar70 +
                      local_408 * fVar123 + local_378 * fVar155 + local_338 * fVar175;
            fVar258 = fStack_54 * fVar100 +
                      fStack_404 * fVar125 + fStack_374 * fVar157 + fStack_334 * fVar178;
            fVar268 = fStack_50 * fVar102 +
                      fStack_400 * fVar130 + fStack_370 * fVar160 + fStack_330 * fVar203;
            fVar161 = fStack_4c * fVar105 +
                      fStack_3fc * fVar142 + fStack_36c * fVar173 + fStack_32c * fVar206;
            fVar131 = local_68 * fVar70 +
                      fVar225 * fVar123 + local_348 * fVar155 + fVar137 * fVar175;
            fVar138 = fStack_64 * fVar100 +
                      fVar225 * fVar125 + fStack_344 * fVar157 + fVar137 * fVar178;
            fVar140 = fStack_60 * fVar102 +
                      fVar225 * fVar130 + fStack_340 * fVar160 + fVar137 * fVar203;
            fVar141 = fStack_5c * fVar105 +
                      fVar225 * fVar142 + fStack_33c * fVar173 + fVar137 * fVar206;
            pfVar1 = (float *)(lVar22 + 0x222f158 + lVar58 * 4);
            fVar211 = *pfVar1;
            fVar212 = pfVar1[1];
            fVar234 = pfVar1[2];
            fVar273 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222fa60 + lVar58 * 4);
            fVar226 = *pfVar1;
            fVar242 = pfVar1[1];
            fVar279 = pfVar1[2];
            fVar280 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222fee4 + lVar58 * 4);
            fVar281 = *pfVar1;
            fVar126 = pfVar1[1];
            fVar289 = pfVar1[2];
            fVar291 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222f5dc + lVar58 * 4);
            fVar293 = *pfVar1;
            fVar259 = pfVar1[1];
            fVar269 = pfVar1[2];
            fVar270 = pfVar1[3];
            fVar174 = local_58 * fVar211 +
                      local_408 * fVar293 + local_378 * fVar226 + local_338 * fVar281;
            fVar176 = fStack_54 * fVar212 +
                      fStack_404 * fVar259 + fStack_374 * fVar242 + fStack_334 * fVar126;
            fVar177 = fStack_50 * fVar234 +
                      fStack_400 * fVar269 + fStack_370 * fVar279 + fStack_330 * fVar289;
            fVar128 = fStack_4c * fVar273 +
                      fStack_3fc * fVar270 + fStack_36c * fVar280 + fStack_32c * fVar291;
            fVar207 = local_68 * fVar211 +
                      fVar225 * fVar293 + local_348 * fVar226 + fVar137 * fVar281;
            fVar71 = fStack_64 * fVar212 +
                     fVar225 * fVar259 + fStack_344 * fVar242 + fVar137 * fVar126;
            fVar179 = fStack_60 * fVar234 +
                      fVar225 * fVar269 + fStack_340 * fVar279 + fVar137 * fVar289;
            fVar101 = fStack_5c * fVar273 +
                      fVar225 * fVar270 + fStack_33c * fVar280 + fVar137 * fVar291;
            auVar266._0_8_ = CONCAT44(fVar258,fVar205) & 0x7fffffff7fffffff;
            auVar266._8_4_ = ABS(fVar268);
            auVar266._12_4_ = ABS(fVar161);
            auVar198._0_8_ = CONCAT44(fVar138,fVar131) & 0x7fffffff7fffffff;
            auVar198._8_4_ = ABS(fVar140);
            auVar198._12_4_ = ABS(fVar141);
            auVar73 = maxps(auVar266,auVar198);
            auVar277._0_8_ =
                 CONCAT44(fVar100 * fStack_3f4 +
                          fVar125 * fStack_3b4 + fVar157 * fStack_364 + fVar178 * fStack_394,
                          fVar70 * local_3f8 +
                          fVar123 * local_3b8 + fVar155 * local_368 + fVar175 * local_398) &
                 0x7fffffff7fffffff;
            auVar277._8_4_ =
                 ABS(fVar102 * fStack_3f0 +
                     fVar130 * fStack_3b0 + fVar160 * fStack_360 + fVar203 * fStack_390);
            auVar277._12_4_ =
                 ABS(fVar105 * fStack_3ec +
                     fVar142 * fStack_3ac + fVar173 * fStack_35c + fVar206 * fStack_38c);
            auVar73 = maxps(auVar73,auVar277);
            uVar65 = -(uint)(local_2b8 <= auVar73._0_4_);
            uVar66 = -(uint)(fStack_2b4 <= auVar73._4_4_);
            uVar67 = -(uint)(fStack_2b0 <= auVar73._8_4_);
            uVar68 = -(uint)(fStack_2ac <= auVar73._12_4_);
            auVar199._0_4_ = ~uVar65 & (uint)fVar201;
            auVar199._4_4_ = ~uVar66 & (uint)fVar213;
            auVar199._8_4_ = ~uVar67 & (uint)fVar220;
            auVar199._12_4_ = ~uVar68 & (uint)fVar221;
            auVar253._0_4_ = (uint)fVar205 & uVar65;
            auVar253._4_4_ = (uint)fVar258 & uVar66;
            auVar253._8_4_ = (uint)fVar268 & uVar67;
            auVar253._12_4_ = (uint)fVar161 & uVar68;
            auVar253 = auVar253 | auVar199;
            fVar157 = (float)(~uVar65 & (uint)fVar254 | (uint)fVar131 & uVar65);
            fVar173 = (float)(~uVar66 & (uint)fVar255 | (uint)fVar138 & uVar66);
            fVar206 = (float)(~uVar67 & (uint)fVar256 | (uint)fVar140 & uVar67);
            fVar138 = (float)(~uVar68 & (uint)fVar257 | (uint)fVar141 & uVar68);
            auVar278._0_8_ = CONCAT44(fVar176,fVar174) & 0x7fffffff7fffffff;
            auVar278._8_4_ = ABS(fVar177);
            auVar278._12_4_ = ABS(fVar128);
            auVar134._0_8_ = CONCAT44(fVar71,fVar207) & 0x7fffffff7fffffff;
            auVar134._8_4_ = ABS(fVar179);
            auVar134._12_4_ = ABS(fVar101);
            auVar73 = maxps(auVar278,auVar134);
            auVar96._0_8_ =
                 CONCAT44(fVar212 * fStack_3f4 +
                          fVar259 * fStack_3b4 + fVar242 * fStack_364 + fVar126 * fStack_394,
                          fVar211 * local_3f8 +
                          fVar293 * local_3b8 + fVar226 * local_368 + fVar281 * local_398) &
                 0x7fffffff7fffffff;
            auVar96._8_4_ =
                 ABS(fVar234 * fStack_3f0 +
                     fVar269 * fStack_3b0 + fVar279 * fStack_360 + fVar289 * fStack_390);
            auVar96._12_4_ =
                 ABS(fVar273 * fStack_3ec +
                     fVar270 * fStack_3ac + fVar280 * fStack_35c + fVar291 * fStack_38c);
            auVar73 = maxps(auVar73,auVar96);
            uVar65 = -(uint)(local_2b8 <= auVar73._0_4_);
            uVar66 = -(uint)(fStack_2b4 <= auVar73._4_4_);
            uVar67 = -(uint)(fStack_2b0 <= auVar73._8_4_);
            uVar68 = -(uint)(fStack_2ac <= auVar73._12_4_);
            fVar281 = (float)((uint)fVar174 & uVar65 | ~uVar65 & (uint)fVar201);
            fVar126 = (float)((uint)fVar176 & uVar66 | ~uVar66 & (uint)fVar213);
            fVar289 = (float)((uint)fVar177 & uVar67 | ~uVar67 & (uint)fVar220);
            fVar291 = (float)((uint)fVar128 & uVar68 | ~uVar68 & (uint)fVar221);
            fVar211 = (float)(~uVar65 & (uint)fVar254 | (uint)fVar207 & uVar65);
            fVar212 = (float)(~uVar66 & (uint)fVar255 | (uint)fVar71 & uVar66);
            fVar213 = (float)(~uVar67 & (uint)fVar256 | (uint)fVar179 & uVar67);
            fVar226 = (float)(~uVar68 & (uint)fVar257 | (uint)fVar101 & uVar68);
            fVar142 = auVar253._0_4_;
            fVar70 = auVar253._4_4_;
            fVar100 = auVar253._8_4_;
            fVar102 = auVar253._12_4_;
            auVar169._0_4_ = fVar157 * fVar157 + fVar142 * fVar142;
            auVar169._4_4_ = fVar173 * fVar173 + fVar70 * fVar70;
            auVar169._8_4_ = fVar206 * fVar206 + fVar100 * fVar100;
            auVar169._12_4_ = fVar138 * fVar138 + fVar102 * fVar102;
            auVar73 = rsqrtps(auVar199,auVar169);
            fVar105 = auVar73._0_4_;
            fVar123 = auVar73._4_4_;
            fVar125 = auVar73._8_4_;
            fVar130 = auVar73._12_4_;
            auVar200._0_4_ = fVar105 * fVar105 * auVar169._0_4_ * 0.5 * fVar105;
            auVar200._4_4_ = fVar123 * fVar123 * auVar169._4_4_ * 0.5 * fVar123;
            auVar200._8_4_ = fVar125 * fVar125 * auVar169._8_4_ * 0.5 * fVar125;
            auVar200._12_4_ = fVar130 * fVar130 * auVar169._12_4_ * 0.5 * fVar130;
            fVar175 = fVar105 * 1.5 - auVar200._0_4_;
            fVar178 = fVar123 * 1.5 - auVar200._4_4_;
            fVar201 = fVar125 * 1.5 - auVar200._8_4_;
            fVar203 = fVar130 * 1.5 - auVar200._12_4_;
            auVar170._0_4_ = fVar211 * fVar211 + fVar281 * fVar281;
            auVar170._4_4_ = fVar212 * fVar212 + fVar126 * fVar126;
            auVar170._8_4_ = fVar213 * fVar213 + fVar289 * fVar289;
            auVar170._12_4_ = fVar226 * fVar226 + fVar291 * fVar291;
            auVar73 = rsqrtps(auVar200,auVar170);
            fVar105 = auVar73._0_4_;
            fVar123 = auVar73._4_4_;
            fVar125 = auVar73._8_4_;
            fVar130 = auVar73._12_4_;
            fVar155 = fVar105 * 1.5 - fVar105 * fVar105 * auVar170._0_4_ * 0.5 * fVar105;
            fVar123 = fVar123 * 1.5 - fVar123 * fVar123 * auVar170._4_4_ * 0.5 * fVar123;
            fVar160 = fVar125 * 1.5 - fVar125 * fVar125 * auVar170._8_4_ * 0.5 * fVar125;
            fVar130 = fVar130 * 1.5 - fVar130 * fVar130 * auVar170._12_4_ * 0.5 * fVar130;
            fVar293 = fVar157 * fVar175 * (float)local_3d8._0_4_;
            fVar269 = fVar173 * fVar178 * (float)local_3d8._4_4_;
            fVar131 = fVar206 * fVar201 * (float)uStack_3d0;
            fVar140 = fVar138 * fVar203 * uStack_3d0._4_4_;
            fVar125 = -fVar142 * fVar175 * (float)local_3d8._0_4_;
            fVar142 = -fVar70 * fVar178 * (float)local_3d8._4_4_;
            fVar157 = -fVar100 * fVar201 * (float)uStack_3d0;
            fVar173 = -fVar102 * fVar203 * uStack_3d0._4_4_;
            fVar220 = fVar175 * 0.0 * (float)local_3d8._0_4_;
            fVar221 = fVar178 * 0.0 * (float)local_3d8._4_4_;
            fVar234 = fVar201 * 0.0 * (float)uStack_3d0;
            fVar273 = fVar203 * 0.0 * uStack_3d0._4_4_;
            local_358 = fVar202 + fVar220;
            fStack_354 = fVar103 + fVar221;
            fStack_350 = fVar204 + fVar234;
            fStack_34c = fVar104 + fVar273;
            fVar207 = fVar211 * fVar155 * auVar168._0_4_;
            fVar71 = fVar212 * fVar123 * auVar168._4_4_;
            fVar179 = fVar213 * fVar160 * auVar168._8_4_;
            fVar101 = fVar226 * fVar130 * auVar168._12_4_;
            fVar226 = fVar267 + fVar207;
            fVar242 = fVar271 + fVar71;
            fVar279 = fVar272 + fVar179;
            fVar280 = fVar274 + fVar101;
            fVar70 = -fVar281 * fVar155 * auVar168._0_4_;
            fVar100 = -fVar126 * fVar123 * auVar168._4_4_;
            fVar102 = -fVar289 * fVar160 * auVar168._8_4_;
            fVar105 = -fVar291 * fVar130 * auVar168._12_4_;
            fVar281 = fVar244 + fVar70;
            fVar126 = fVar247 + fVar100;
            fVar289 = fStack_3a0 + fVar102;
            fVar291 = fStack_39c + fVar105;
            fVar178 = fVar155 * 0.0 * auVar168._0_4_;
            fVar203 = fVar123 * 0.0 * auVar168._4_4_;
            fVar211 = fVar160 * 0.0 * auVar168._8_4_;
            fVar213 = fVar130 * 0.0 * auVar168._12_4_;
            fVar123 = (float)local_388._0_4_ - fVar293;
            fVar130 = (float)local_388._4_4_ - fVar269;
            fVar155 = (float)uStack_380 - fVar131;
            fVar160 = uStack_380._4_4_ - fVar140;
            fVar259 = fVar106 + fVar178;
            fVar270 = fVar124 + fVar203;
            fVar138 = fVar127 + fVar211;
            fVar141 = fVar129 + fVar213;
            fVar175 = fVar227 - fVar125;
            fVar201 = fVar235 - fVar142;
            fVar206 = fVar222 - fVar157;
            fVar212 = fVar236 - fVar173;
            fVar202 = fVar202 - fVar220;
            fVar103 = fVar103 - fVar221;
            fVar204 = fVar204 - fVar234;
            fVar104 = fVar104 - fVar273;
            uVar65 = -(uint)(0.0 < (fVar175 * (fVar259 - fVar202) - fVar202 * (fVar281 - fVar175)) *
                                   0.0 + (fVar202 * (fVar226 - fVar123) -
                                         (fVar259 - fVar202) * fVar123) * 0.0 +
                                         ((fVar281 - fVar175) * fVar123 -
                                         (fVar226 - fVar123) * fVar175));
            uVar66 = -(uint)(0.0 < (fVar201 * (fVar270 - fVar103) - fVar103 * (fVar126 - fVar201)) *
                                   0.0 + (fVar103 * (fVar242 - fVar130) -
                                         (fVar270 - fVar103) * fVar130) * 0.0 +
                                         ((fVar126 - fVar201) * fVar130 -
                                         (fVar242 - fVar130) * fVar201));
            uVar67 = -(uint)(0.0 < (fVar206 * (fVar138 - fVar204) - fVar204 * (fVar289 - fVar206)) *
                                   0.0 + (fVar204 * (fVar279 - fVar155) -
                                         (fVar138 - fVar204) * fVar155) * 0.0 +
                                         ((fVar289 - fVar206) * fVar155 -
                                         (fVar279 - fVar155) * fVar206));
            uVar68 = -(uint)(0.0 < (fVar212 * (fVar141 - fVar104) - fVar104 * (fVar291 - fVar212)) *
                                   0.0 + (fVar104 * (fVar280 - fVar160) -
                                         (fVar141 - fVar104) * fVar160) * 0.0 +
                                         ((fVar291 - fVar212) * fVar160 -
                                         (fVar280 - fVar160) * fVar212));
            local_3c8 = (float)((uint)(fVar267 - fVar207) & uVar65 |
                               ~uVar65 & (uint)((float)local_388._0_4_ + fVar293));
            fStack_3c4 = (float)((uint)(fVar271 - fVar71) & uVar66 |
                                ~uVar66 & (uint)((float)local_388._4_4_ + fVar269));
            fStack_3c0 = (float)((uint)(fVar272 - fVar179) & uVar67 |
                                ~uVar67 & (uint)((float)uStack_380 + fVar131));
            fStack_3bc = (float)((uint)(fVar274 - fVar101) & uVar68 |
                                ~uVar68 & (uint)(uStack_380._4_4_ + fVar140));
            fVar220 = (float)((uint)(fVar244 - fVar70) & uVar65 |
                             ~uVar65 & (uint)(fVar227 + fVar125));
            fVar221 = (float)((uint)(fVar247 - fVar100) & uVar66 |
                             ~uVar66 & (uint)(fVar235 + fVar142));
            fStack_3a0 = (float)((uint)(fStack_3a0 - fVar102) & uVar67 |
                                ~uVar67 & (uint)(fVar222 + fVar157));
            fStack_39c = (float)((uint)(fStack_39c - fVar105) & uVar68 |
                                ~uVar68 & (uint)(fVar236 + fVar173));
            fVar293 = (float)((uint)(fVar106 - fVar178) & uVar65 | ~uVar65 & (uint)local_358);
            fVar269 = (float)((uint)(fVar124 - fVar203) & uVar66 | ~uVar66 & (uint)fStack_354);
            fVar106 = (float)((uint)(fVar127 - fVar211) & uVar67 | ~uVar67 & (uint)fStack_350);
            fVar124 = (float)((uint)(fVar129 - fVar213) & uVar68 | ~uVar68 & (uint)fStack_34c);
            fVar125 = (float)((uint)fVar123 & uVar65 | ~uVar65 & (uint)fVar226);
            fVar142 = (float)((uint)fVar130 & uVar66 | ~uVar66 & (uint)fVar242);
            fVar157 = (float)((uint)fVar155 & uVar67 | ~uVar67 & (uint)fVar279);
            fVar173 = (float)((uint)fVar160 & uVar68 | ~uVar68 & (uint)fVar280);
            fVar178 = (float)((uint)fVar175 & uVar65 | ~uVar65 & (uint)fVar281);
            fVar203 = (float)((uint)fVar201 & uVar66 | ~uVar66 & (uint)fVar126);
            fVar211 = (float)((uint)fVar206 & uVar67 | ~uVar67 & (uint)fVar289);
            fVar213 = (float)((uint)fVar212 & uVar68 | ~uVar68 & (uint)fVar291);
            fVar227 = (float)((uint)fVar202 & uVar65 | ~uVar65 & (uint)fVar259);
            fVar234 = (float)((uint)fVar103 & uVar66 | ~uVar66 & (uint)fVar270);
            fVar235 = (float)((uint)fVar204 & uVar67 | ~uVar67 & (uint)fVar138);
            fVar273 = (float)((uint)fVar104 & uVar68 | ~uVar68 & (uint)fVar141);
            fVar222 = (float)((uint)fVar226 & uVar65 | ~uVar65 & (uint)fVar123) - local_3c8;
            fVar226 = (float)((uint)fVar242 & uVar66 | ~uVar66 & (uint)fVar130) - fStack_3c4;
            fVar236 = (float)((uint)fVar279 & uVar67 | ~uVar67 & (uint)fVar155) - fStack_3c0;
            fVar242 = (float)((uint)fVar280 & uVar68 | ~uVar68 & (uint)fVar160) - fStack_3bc;
            fVar175 = (float)((uint)fVar281 & uVar65 | ~uVar65 & (uint)fVar175) - fVar220;
            fVar201 = (float)((uint)fVar126 & uVar66 | ~uVar66 & (uint)fVar201) - fVar221;
            fVar206 = (float)((uint)fVar289 & uVar67 | ~uVar67 & (uint)fVar206) - fStack_3a0;
            fVar212 = (float)((uint)fVar291 & uVar68 | ~uVar68 & (uint)fVar212) - fStack_39c;
            fVar244 = (float)((uint)fVar259 & uVar65 | ~uVar65 & (uint)fVar202) - fVar293;
            fVar247 = (float)((uint)fVar270 & uVar66 | ~uVar66 & (uint)fVar103) - fVar269;
            fVar267 = (float)((uint)fVar138 & uVar67 | ~uVar67 & (uint)fVar204) - fVar106;
            fVar271 = (float)((uint)fVar141 & uVar68 | ~uVar68 & (uint)fVar104) - fVar124;
            fVar281 = local_3c8 - fVar125;
            fVar126 = fStack_3c4 - fVar142;
            fVar289 = fStack_3c0 - fVar157;
            fVar291 = fStack_3bc - fVar173;
            fVar70 = fVar220 - fVar178;
            fVar100 = fVar221 - fVar203;
            fVar102 = fStack_3a0 - fVar211;
            fVar105 = fStack_39c - fVar213;
            local_3a8 = (RTCIntersectArguments *)CONCAT44(fVar221,fVar220);
            fVar123 = fVar293 - fVar227;
            fVar130 = fVar269 - fVar234;
            fVar155 = fVar106 - fVar235;
            fVar160 = fVar124 - fVar273;
            fVar272 = (fVar220 * fVar244 - fVar293 * fVar175) * 0.0 +
                      (fVar293 * fVar222 - local_3c8 * fVar244) * 0.0 +
                      (local_3c8 * fVar175 - fVar220 * fVar222);
            fVar274 = (fVar221 * fVar247 - fVar269 * fVar201) * 0.0 +
                      (fVar269 * fVar226 - fStack_3c4 * fVar247) * 0.0 +
                      (fStack_3c4 * fVar201 - fVar221 * fVar226);
            auVar153._4_4_ = fVar274;
            auVar153._0_4_ = fVar272;
            fVar279 = (fStack_3a0 * fVar267 - fVar106 * fVar206) * 0.0 +
                      (fVar106 * fVar236 - fStack_3c0 * fVar267) * 0.0 +
                      (fStack_3c0 * fVar206 - fStack_3a0 * fVar236);
            fVar280 = (fStack_39c * fVar271 - fVar124 * fVar212) * 0.0 +
                      (fVar124 * fVar242 - fStack_3bc * fVar271) * 0.0 +
                      (fStack_3bc * fVar212 - fStack_39c * fVar242);
            auVar284._0_4_ =
                 (fVar178 * fVar123 - fVar227 * fVar70) * 0.0 +
                 (fVar227 * fVar281 - fVar125 * fVar123) * 0.0 +
                 (fVar125 * fVar70 - fVar178 * fVar281);
            auVar284._4_4_ =
                 (fVar203 * fVar130 - fVar234 * fVar100) * 0.0 +
                 (fVar234 * fVar126 - fVar142 * fVar130) * 0.0 +
                 (fVar142 * fVar100 - fVar203 * fVar126);
            auVar284._8_4_ =
                 (fVar211 * fVar155 - fVar235 * fVar102) * 0.0 +
                 (fVar235 * fVar289 - fVar157 * fVar155) * 0.0 +
                 (fVar157 * fVar102 - fVar211 * fVar289);
            auVar284._12_4_ =
                 (fVar213 * fVar160 - fVar273 * fVar105) * 0.0 +
                 (fVar273 * fVar291 - fVar173 * fVar160) * 0.0 +
                 (fVar173 * fVar105 - fVar213 * fVar291);
            auVar153._8_4_ = fVar279;
            auVar153._12_4_ = fVar280;
            auVar73 = maxps(auVar153,auVar284);
            bVar50 = auVar73._0_4_ <= 0.0 && bVar50;
            auVar154._0_4_ = -(uint)bVar50;
            bVar23 = auVar73._4_4_ <= 0.0 && bVar23;
            auVar154._4_4_ = -(uint)bVar23;
            bVar24 = auVar73._8_4_ <= 0.0 && bVar24;
            auVar154._8_4_ = -(uint)bVar24;
            bVar25 = auVar73._12_4_ <= 0.0 && bVar25;
            auVar154._12_4_ = -(uint)bVar25;
            iVar51 = movmskps((int)(bspline_basis1 + lVar22),auVar154);
            if (iVar51 == 0) {
LAB_00be94ec:
              iVar51 = 0;
              auVar136._8_8_ = uStack_2e0;
              auVar136._0_8_ = local_2e8;
            }
            else {
              fVar125 = ray->tfar;
              fVar157 = fVar70 * fVar244 - fVar123 * fVar175;
              fVar173 = fVar100 * fVar247 - fVar130 * fVar201;
              fVar178 = fVar102 * fVar267 - fVar155 * fVar206;
              fVar203 = fVar105 * fVar271 - fVar160 * fVar212;
              fVar123 = fVar123 * fVar222 - fVar244 * fVar281;
              fVar130 = fVar130 * fVar226 - fVar247 * fVar126;
              fVar142 = fVar155 * fVar236 - fVar267 * fVar289;
              fVar155 = fVar160 * fVar242 - fVar271 * fVar291;
              fVar160 = fVar281 * fVar175 - fVar70 * fVar222;
              fVar175 = fVar126 * fVar201 - fVar100 * fVar226;
              fVar201 = fVar289 * fVar206 - fVar102 * fVar236;
              fVar206 = fVar291 * fVar212 - fVar105 * fVar242;
              auVar135._0_4_ = fVar123 * 0.0 + fVar160;
              auVar135._4_4_ = fVar130 * 0.0 + fVar175;
              auVar135._8_4_ = fVar142 * 0.0 + fVar201;
              auVar135._12_4_ = fVar155 * 0.0 + fVar206;
              auVar210._0_4_ = fVar157 * 0.0 + auVar135._0_4_;
              auVar210._4_4_ = fVar173 * 0.0 + auVar135._4_4_;
              auVar210._8_4_ = fVar178 * 0.0 + auVar135._8_4_;
              auVar210._12_4_ = fVar203 * 0.0 + auVar135._12_4_;
              auVar73 = rcpps(auVar135,auVar210);
              fVar70 = auVar73._0_4_;
              fVar100 = auVar73._4_4_;
              fVar102 = auVar73._8_4_;
              fVar105 = auVar73._12_4_;
              fVar70 = (1.0 - auVar210._0_4_ * fVar70) * fVar70 + fVar70;
              fVar100 = (1.0 - auVar210._4_4_ * fVar100) * fVar100 + fVar100;
              fVar102 = (1.0 - auVar210._8_4_ * fVar102) * fVar102 + fVar102;
              fVar105 = (1.0 - auVar210._12_4_ * fVar105) * fVar105 + fVar105;
              fVar123 = (fVar293 * fVar160 + fVar220 * fVar123 + local_3c8 * fVar157) * fVar70;
              fVar130 = (fVar269 * fVar175 + fVar221 * fVar130 + fStack_3c4 * fVar173) * fVar100;
              fVar142 = (fVar106 * fVar201 + fStack_3a0 * fVar142 + fStack_3c0 * fVar178) * fVar102;
              fVar155 = (fVar124 * fVar206 + fStack_39c * fVar155 + fStack_3bc * fVar203) * fVar105;
              bVar50 = (fVar123 <= fVar125 && (float)local_1e8._0_4_ <= fVar123) && bVar50;
              auVar171._0_4_ = -(uint)bVar50;
              bVar23 = (fVar130 <= fVar125 && (float)local_1e8._4_4_ <= fVar130) && bVar23;
              auVar171._4_4_ = -(uint)bVar23;
              bVar24 = (fVar142 <= fVar125 && fStack_1e0 <= fVar142) && bVar24;
              auVar171._8_4_ = -(uint)bVar24;
              bVar25 = (fVar155 <= fVar125 && fStack_1dc <= fVar155) && bVar25;
              auVar171._12_4_ = -(uint)bVar25;
              iVar51 = movmskps(iVar51,auVar171);
              if (iVar51 == 0) goto LAB_00be94ec;
              auVar172._0_8_ =
                   CONCAT44(-(uint)(auVar210._4_4_ != 0.0 && bVar23),
                            -(uint)(auVar210._0_4_ != 0.0 && bVar50));
              auVar172._8_4_ = -(uint)(auVar210._8_4_ != 0.0 && bVar24);
              auVar172._12_4_ = -(uint)(auVar210._12_4_ != 0.0 && bVar25);
              iVar51 = movmskps(iVar51,auVar172);
              auVar136._8_8_ = uStack_2e0;
              auVar136._0_8_ = local_2e8;
              if (iVar51 != 0) {
                fVar272 = fVar272 * fVar70;
                fVar274 = fVar274 * fVar100;
                fVar279 = fVar279 * fVar102;
                fVar280 = fVar280 * fVar105;
                local_2f8 = (float)((uint)(1.0 - fVar272) & uVar65 | ~uVar65 & (uint)fVar272);
                fStack_2f4 = (float)((uint)(1.0 - fVar274) & uVar66 | ~uVar66 & (uint)fVar274);
                fStack_2f0 = (float)((uint)(1.0 - fVar279) & uVar67 | ~uVar67 & (uint)fVar279);
                fStack_2ec = (float)((uint)(1.0 - fVar280) & uVar68 | ~uVar68 & (uint)fVar280);
                local_1d8 = (float)(~uVar65 & (uint)(auVar284._0_4_ * fVar70) |
                                   (uint)(1.0 - auVar284._0_4_ * fVar70) & uVar65);
                fStack_1d4 = (float)(~uVar66 & (uint)(auVar284._4_4_ * fVar100) |
                                    (uint)(1.0 - auVar284._4_4_ * fVar100) & uVar66);
                fStack_1d0 = (float)(~uVar67 & (uint)(auVar284._8_4_ * fVar102) |
                                    (uint)(1.0 - auVar284._8_4_ * fVar102) & uVar67);
                fStack_1cc = (float)(~uVar68 & (uint)(auVar284._12_4_ * fVar105) |
                                    (uint)(1.0 - auVar284._12_4_ * fVar105) & uVar68);
                auVar136._8_4_ = auVar172._8_4_;
                auVar136._0_8_ = auVar172._0_8_;
                auVar136._12_4_ = auVar172._12_4_;
                local_278 = fVar123;
                fStack_274 = fVar130;
                fStack_270 = fVar142;
                fStack_26c = fVar155;
              }
            }
            iVar51 = movmskps(iVar51,auVar136);
            _local_3e8 = auVar168;
            _local_318 = auVar219;
            local_268 = fVar254;
            fStack_264 = fVar255;
            fStack_260 = fVar256;
            fStack_25c = fVar257;
            if (iVar51 != 0) {
              fVar100 = (auVar168._0_4_ - (float)local_3d8._0_4_) * local_2f8 +
                        (float)local_3d8._0_4_;
              fVar102 = (auVar168._4_4_ - (float)local_3d8._4_4_) * fStack_2f4 +
                        (float)local_3d8._4_4_;
              fVar105 = (auVar168._8_4_ - (float)uStack_3d0) * fStack_2f0 + (float)uStack_3d0;
              fVar123 = (auVar168._12_4_ - uStack_3d0._4_4_) * fStack_2ec + uStack_3d0._4_4_;
              fVar70 = local_300->depth_scale;
              auVar97._0_4_ = -(uint)(fVar70 * (fVar100 + fVar100) < local_278) & auVar136._0_4_;
              auVar97._4_4_ = -(uint)(fVar70 * (fVar102 + fVar102) < fStack_274) & auVar136._4_4_;
              auVar97._8_4_ = -(uint)(fVar70 * (fVar105 + fVar105) < fStack_270) & auVar136._8_4_;
              auVar97._12_4_ = -(uint)(fVar70 * (fVar123 + fVar123) < fStack_26c) & auVar136._12_4_;
              uVar65 = movmskps((int)local_300,auVar97);
              if (uVar65 != 0) {
                local_1d8 = local_1d8 + local_1d8 + -1.0;
                fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
                fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
                fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
                local_158 = CONCAT44(fStack_244,local_248);
                uStack_150 = CONCAT44(fStack_23c,fStack_240);
                local_148 = CONCAT44(fStack_84,local_88);
                uStack_140 = CONCAT44(fStack_7c,fStack_80);
                local_138 = CONCAT44(fStack_94,local_98);
                uStack_130 = CONCAT44(fStack_8c,fStack_90);
                local_128 = CONCAT44(fStack_74,local_78);
                uStack_120 = CONCAT44(fStack_6c,fStack_70);
                auVar59 = (undefined1  [8])(context->scene->geometries).items[local_308].ptr;
                local_198 = local_2f8;
                fStack_194 = fStack_2f4;
                fStack_190 = fStack_2f0;
                fStack_18c = fStack_2ec;
                local_188 = local_1d8;
                fStack_184 = fStack_1d4;
                fStack_180 = fStack_1d0;
                fStack_17c = fStack_1cc;
                local_178 = local_278;
                fStack_174 = fStack_274;
                fStack_170 = fStack_270;
                fStack_16c = fStack_26c;
                local_168 = uVar64;
                local_118 = auVar97;
                if ((((Geometry *)auVar59)->mask & ray->mask) == 0) {
                  pRVar55 = (RTCIntersectArguments *)0x0;
                  local_164 = fVar139;
                }
                else {
                  pRVar55 = context->args;
                  if ((pRVar55->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar55 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar55 >> 8),1),
                     local_164 = fVar139,
                     ((Geometry *)auVar59)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar70 = (float)(int)uVar64;
                    local_108[0] = (fVar70 + local_2f8 + 0.0) * (float)local_1f8._0_4_;
                    local_108[1] = (fVar70 + fStack_2f4 + 1.0) * (float)local_1f8._4_4_;
                    local_108[2] = (fVar70 + fStack_2f0 + 2.0) * fStack_1f0;
                    local_108[3] = (fVar70 + fStack_2ec + 3.0) * fStack_1ec;
                    local_f8 = CONCAT44(fStack_1d4,local_1d8);
                    uStack_f0 = CONCAT44(fStack_1cc,fStack_1d0);
                    local_e8[0] = local_278;
                    local_e8[1] = fStack_274;
                    local_e8[2] = fStack_270;
                    local_e8[3] = fStack_26c;
                    uVar60 = (ulong)(uVar65 & 0xff);
                    pRVar53 = (RTCIntersectArguments *)0x0;
                    if (uVar60 != 0) {
                      for (; ((uVar65 & 0xff) >> (long)pRVar53 & 1) == 0;
                          pRVar53 = (RTCIntersectArguments *)((long)&pRVar53->flags + 1)) {
                      }
                    }
                    uStack_3e0 = uStack_140;
                    local_3e8 = (undefined1  [8])local_148;
                    uStack_380 = uStack_130;
                    local_388 = (undefined1  [8])local_138;
                    uVar56 = CONCAT71((int7)((ulong)pRVar55 >> 8),1);
                    local_3d8 = auVar59;
                    local_258 = local_128;
                    uStack_250 = uStack_120;
                    local_164 = fVar139;
                    do {
                      local_318._0_4_ = (int)uVar56;
                      local_22c = local_108[(long)pRVar53];
                      local_228 = *(undefined4 *)((long)&local_f8 + (long)pRVar53 * 4);
                      local_3c8 = ray->tfar;
                      ray->tfar = local_e8[(long)pRVar53];
                      local_2a8.context = context->user;
                      fVar102 = 1.0 - local_22c;
                      fVar105 = local_22c * fVar102 * 4.0;
                      fVar70 = -fVar102 * fVar102 * 0.5;
                      fVar100 = (-local_22c * local_22c - fVar105) * 0.5;
                      fVar102 = (fVar102 * fVar102 + fVar105) * 0.5;
                      fVar105 = local_22c * local_22c * 0.5;
                      local_238 = CONCAT44(fVar70 * fStack_244 +
                                           fVar100 * (float)local_3e8._4_4_ +
                                           fVar102 * (float)local_388._4_4_ +
                                           fVar105 * local_258._4_4_,
                                           fVar70 * local_248 +
                                           fVar100 * (float)local_3e8._0_4_ +
                                           fVar102 * (float)local_388._0_4_ +
                                           fVar105 * (float)local_258);
                      local_230 = fVar70 * fStack_240 +
                                  fVar100 * (float)uStack_3e0 +
                                  fVar102 * (float)uStack_380 + fVar105 * (float)uStack_250;
                      local_224 = (undefined4)local_200;
                      local_220 = (undefined4)local_308;
                      local_21c = (local_2a8.context)->instID[0];
                      local_218 = (local_2a8.context)->instPrimID[0];
                      local_40c = -1;
                      local_2a8.valid = &local_40c;
                      pRVar55 = (RTCIntersectArguments *)((Geometry *)auVar59)->userPtr;
                      local_2a8.hit = (RTCHitN *)&local_238;
                      local_2a8.N = 1;
                      local_3a8 = pRVar53;
                      local_2a8.geometryUserPtr = pRVar55;
                      local_2a8.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar59)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00be93c3:
                        pRVar55 = context->args;
                        if (pRVar55->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar55->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((((Geometry *)auVar59)->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar55->filter)(&local_2a8);
                            auVar59 = local_3d8;
                          }
                          if (*local_2a8.valid == 0) goto LAB_00be940c;
                        }
                        uVar56 = (ulong)(uint)local_318._0_4_;
                        break;
                      }
                      (*((Geometry *)auVar59)->occlusionFilterN)(&local_2a8);
                      auVar59 = local_3d8;
                      if (*local_2a8.valid != 0) goto LAB_00be93c3;
LAB_00be940c:
                      ray->tfar = local_3c8;
                      uVar60 = uVar60 ^ 1L << ((ulong)local_3a8 & 0x3f);
                      pRVar53 = (RTCIntersectArguments *)0x0;
                      if (uVar60 != 0) {
                        for (; (uVar60 >> (long)pRVar53 & 1) == 0;
                            pRVar53 = (RTCIntersectArguments *)((long)&pRVar53->flags + 1)) {
                        }
                      }
                      uVar56 = CONCAT71((int7)((ulong)pRVar55 >> 8),uVar60 != 0);
                    } while (uVar60 != 0);
                    pRVar55 = (RTCIntersectArguments *)(uVar56 & 0xffffffffffffff01);
                  }
                }
                bVar62 = (bool)(bVar62 | (byte)pRVar55);
              }
            }
          }
          uVar54 = SUB84(pRVar55,0);
          lVar58 = lVar58 + 4;
          fVar201 = local_408;
          fVar289 = fStack_404;
          fVar291 = fStack_400;
          fVar293 = fStack_3fc;
        } while ((int)lVar58 < (int)fVar139);
      }
      if (bVar62 != false) {
        return local_449;
      }
      fVar139 = ray->tfar;
      auVar122._4_4_ = -(uint)(fStack_44 <= fVar139);
      auVar122._0_4_ = -(uint)(local_48 <= fVar139);
      auVar122._8_4_ = -(uint)(fStack_40 <= fVar139);
      auVar122._12_4_ = -(uint)(fStack_3c <= fVar139);
      uVar64 = movmskps(uVar54,auVar122);
      uVar63 = uVar63 & uVar63 + 0xf & uVar64;
      local_449 = uVar63 != 0;
    } while (local_449);
  }
  return local_449;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }